

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O3

int __thiscall asmjit::v1_14::RALocalAllocator::init(RALocalAllocator *this,EVP_PKEY_CTX *ctx)

{
  RAAssignment *this_00;
  uint **ppuVar1;
  byte bVar2;
  WorkToPhysMap WVar3;
  BaseNode BVar4;
  BaseNode BVar5;
  InstNode IVar6;
  BaseBuilder *pBVar7;
  char *pcVar8;
  long lVar9;
  BaseNode *pBVar10;
  uint *puVar11;
  undefined1 *puVar12;
  ZoneAllocator *pZVar13;
  undefined4 workId;
  RegGroup RVar14;
  Error EVar15;
  int iVar16;
  uint uVar17;
  int extraout_EAX;
  int iVar18;
  uint32_t uVar19;
  PhysToWorkMap *pPVar20;
  WorkToPhysMap *pWVar21;
  PhysToWorkMap *pPVar22;
  ulong uVar23;
  RAStackSlot *pRVar24;
  BaseRAPass *pBVar25;
  RABlock *pRVar26;
  BaseNode *pBVar27;
  byte bVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  BaseRAPass *pBVar33;
  BaseRAPass *pBVar34;
  uint uVar35;
  uint extraout_EDX;
  uint extraout_EDX_00;
  long *extraout_RDX;
  uint *puVar36;
  BaseRAPass *extraout_RDX_00;
  BaseRAPass *extraout_RDX_01;
  BaseRAPass *extraout_RDX_02;
  BaseRAPass *extraout_RDX_03;
  BaseRAPass *extraout_RDX_04;
  BaseRAPass *extraout_RDX_05;
  BaseRAPass *extraout_RDX_06;
  BaseRAPass *extraout_RDX_07;
  BaseRAPass *pBVar37;
  RABlock *block;
  uint uVar38;
  RAAssignment *pRVar39;
  BaseRAPass *pBVar40;
  ulong unaff_RBP;
  BaseRAPass *pBVar41;
  uint uVar42;
  BaseRAPass *pBVar43;
  InstNode *pIVar44;
  BaseRAPass *pBVar45;
  BaseRAPass *pBVar46;
  BaseRAPass *pBVar47;
  BaseRAPass *pBVar48;
  BaseCompiler *pBVar49;
  ulong uVar50;
  BaseRAPass *pBVar51;
  BaseRAPass *pBVar52;
  BaseRAPass *pBVar53;
  uint uVar54;
  uint *puVar55;
  _func_int **pp_Var56;
  long lVar57;
  BaseRAPass *unaff_R12;
  BaseRAPass *unaff_R13;
  BaseRAPass *pBVar58;
  InstNode *pIVar59;
  ulong uVar60;
  BaseRAPass *pBVar61;
  BaseRAPass *pBVar62;
  BaseRAPass *pBVar63;
  BaseRAPass *pBVar64;
  bool bVar65;
  char cVar66;
  undefined4 uStack_5a8;
  undefined4 uStack_5a4;
  undefined4 uStack_5a0;
  undefined4 uStack_59c;
  undefined8 uStack_598;
  undefined8 uStack_590;
  long lStack_580;
  BaseRAPass *pBStack_578;
  InstNode *pIStack_570;
  BaseRAPass *pBStack_568;
  long lStack_560;
  BaseRAPass *pBStack_558;
  ulong uStack_548;
  BaseRAPass *pBStack_540;
  InstNode *pIStack_538;
  BaseRAPass *pBStack_530;
  BaseRAPass *pBStack_528;
  BaseRAPass *pBStack_520;
  BaseRAPass *pBStack_518;
  BaseRAPass *pBStack_510;
  BaseRAPass *pBStack_508;
  BaseRAPass *pBStack_500;
  BaseRAPass *pBStack_4f8;
  BaseRAPass *pBStack_4f0;
  BaseRAPass *pBStack_4e8;
  BaseRAPass *pBStack_4e0;
  BaseRAPass *pBStack_4d8;
  BaseRAPass *pBStack_4d0;
  code *pcStack_4c8;
  BaseRAPass *pBStack_4c0;
  BaseRAPass *pBStack_4b8;
  uint uStack_4b0;
  uint uStack_4ac;
  BaseRAPass *pBStack_4a8;
  char cStack_49d;
  uint uStack_49c;
  BaseRAPass *pBStack_498;
  BaseRAPass *pBStack_490;
  BaseRAPass *pBStack_488;
  uint uStack_47c;
  BaseRAPass *pBStack_478;
  BaseRAPass *pBStack_470;
  BaseRAPass *pBStack_468;
  _func_int **pp_Stack_460;
  BaseRAPass *pBStack_458;
  uint uStack_44c;
  BaseRAPass *pBStack_448;
  InstNode *pIStack_440;
  ulong uStack_438;
  BaseRAPass *pBStack_430;
  ulong uStack_428;
  undefined1 auStack_420 [64];
  long alStack_3e0 [32];
  undefined8 auStack_2e0 [33];
  BaseRAPass *pBStack_1d8;
  BaseRAPass *pBStack_1d0;
  BaseRAPass *pBStack_1c8;
  ulong uStack_1c0;
  RAAssignment *pRStack_1b8;
  BaseRAPass *pBStack_1b0;
  RAAssignment *pRStack_1a8;
  BaseRAPass *pBStack_1a0;
  ulong uStack_198;
  PhysToWorkMap *pPStack_190;
  code *pcStack_188;
  BaseRAPass *pBStack_180;
  uint uStack_174;
  BaseRAPass *pBStack_170;
  char cStack_164;
  RAAssignment *pRStack_160;
  uint *puStack_158;
  BaseRAPass *pBStack_150;
  long *plStack_148;
  BaseRAPass *pBStack_140;
  uint uStack_138;
  char cStack_134;
  uint *puStack_130;
  ulong uStack_128;
  ArchTraits **ppAStack_120;
  PhysToWorkMap *pPStack_118;
  anon_union_4_2_ebeb14a8_for_RARegCount_0 aStack_110;
  uint uStack_10c;
  int iStack_108;
  uint uStack_104;
  RAWorkRegs *pRStack_100;
  PhysToWorkMap *pPStack_f8;
  BaseRAPass *pBStack_f0;
  uint *apuStack_e8 [4];
  RAAssignment *pRStack_c8;
  BaseRAPass *pBStack_c0;
  BaseRAPass *pBStack_b8;
  ulong uStack_b0;
  PhysToWorkMap *pPStack_a8;
  ulong uStack_a0;
  RALocalAllocator *pRStack_98;
  ulong uStack_90;
  long lStack_88;
  BaseRAPass *pBStack_80;
  ulong uStack_78;
  RAAssignment *pRStack_70;
  ulong uStack_68;
  BaseRAPass *pBStack_60;
  RALocalAllocator *pRStack_58;
  BaseRAPass *pBStack_50;
  
  pPVar20 = BaseRAPass::newPhysToWorkMap(this->_pass);
  pBVar37 = this->_pass;
  pWVar21 = BaseRAPass::newWorkToPhysMap(pBVar37);
  uVar60 = 1;
  if (pWVar21 == (WorkToPhysMap *)0x0 || pPVar20 == (PhysToWorkMap *)0x0) goto LAB_00121865;
  if ((this->_curAssignment)._physToWorkMap == (PhysToWorkMap *)0x0) {
    if ((this->_curAssignment)._workToPhysMap != (WorkToPhysMap *)0x0) goto LAB_00121879;
    pBVar37 = this->_pass;
    bVar28 = (pBVar37->_physRegCount).field_0._regs[0];
    uVar29 = (uint)(pBVar37->_physRegCount).field_0._regs[1] + (uint)bVar28;
    if (0xff < uVar29) goto LAB_0012187e;
    uVar42 = (pBVar37->_physRegCount).field_0._regs[2] + uVar29;
    ctx = (EVP_PKEY_CTX *)(ulong)uVar42;
    if (0xff < uVar42) goto LAB_00121883;
    uVar35 = uVar42 * 0x1000000 | uVar29 * 0x10000 | (uint)bVar28 << 8;
    (this->_curAssignment)._layout.physIndex.super_RARegCount.field_0._packed = uVar35;
    uVar29 = (pBVar37->_physRegCount).field_0._packed;
    (this->_curAssignment)._layout.physCount.field_0._packed = uVar29;
    (this->_curAssignment)._layout.physTotal = (uVar29 >> 0x18) + uVar42;
    (this->_curAssignment)._layout.workCount = *(uint32_t *)&pBVar37->field_0x148;
    (this->_curAssignment)._layout.workRegs = &pBVar37->_workRegs;
    (this->_curAssignment)._physToWorkMap = pPVar20;
    (this->_curAssignment)._workToPhysMap = pWVar21;
    lVar32 = 0;
    do {
      *(uint32_t **)((long)(this->_curAssignment)._physToWorkIds._data + lVar32) =
           pPVar20->workIds + (uVar35 >> ((byte)lVar32 & 0x1f) & 0xff);
      lVar32 = lVar32 + 8;
    } while (lVar32 != 0x20);
    pPVar20 = BaseRAPass::newPhysToWorkMap(pBVar37);
    unaff_R12 = (BaseRAPass *)BaseRAPass::newWorkToPhysMap(this->_pass);
    pBVar37 = this->_pass;
    pWVar21 = BaseRAPass::newWorkToPhysMap(pBVar37);
    this->_tmpWorkToPhysMap = pWVar21;
    if (pWVar21 == (WorkToPhysMap *)0x0 ||
        (unaff_R12 == (BaseRAPass *)0x0 || pPVar20 == (PhysToWorkMap *)0x0)) {
LAB_00121865:
      return (int)uVar60;
    }
    if ((this->_tmpAssignment)._physToWorkMap != (PhysToWorkMap *)0x0) goto LAB_00121888;
    if ((this->_tmpAssignment)._workToPhysMap != (WorkToPhysMap *)0x0) goto LAB_0012188d;
    pBVar41 = this->_pass;
    bVar28 = (pBVar41->_physRegCount).field_0._regs[0];
    uVar29 = (uint)(pBVar41->_physRegCount).field_0._regs[1] + (uint)bVar28;
    if (uVar29 < 0x100) {
      uVar42 = (pBVar41->_physRegCount).field_0._regs[2] + uVar29;
      ctx = (EVP_PKEY_CTX *)(ulong)uVar42;
      if (uVar42 < 0x100) {
        uVar35 = uVar42 * 0x1000000 | uVar29 * 0x10000 | (uint)bVar28 << 8;
        (this->_tmpAssignment)._layout.physIndex.super_RARegCount.field_0._packed = uVar35;
        uVar29 = (pBVar41->_physRegCount).field_0._packed;
        (this->_tmpAssignment)._layout.physCount.field_0._packed = uVar29;
        (this->_tmpAssignment)._layout.physTotal = (uVar29 >> 0x18) + uVar42;
        (this->_tmpAssignment)._layout.workCount = *(uint32_t *)&pBVar41->field_0x148;
        (this->_tmpAssignment)._layout.workRegs = &pBVar41->_workRegs;
        (this->_tmpAssignment)._physToWorkMap = pPVar20;
        (this->_tmpAssignment)._workToPhysMap = (WorkToPhysMap *)unaff_R12;
        uVar60 = 0;
        lVar32 = 0;
        do {
          *(uint32_t **)((long)(this->_tmpAssignment)._physToWorkIds._data + lVar32) =
               pPVar20->workIds + (uVar35 >> ((byte)lVar32 & 0x1f) & 0xff);
          lVar32 = lVar32 + 8;
        } while (lVar32 != 0x20);
        goto LAB_00121865;
      }
      goto LAB_00121897;
    }
  }
  else {
    init((EVP_PKEY_CTX *)pBVar37);
LAB_00121879:
    init((EVP_PKEY_CTX *)pBVar37);
LAB_0012187e:
    init((EVP_PKEY_CTX *)pBVar37);
LAB_00121883:
    init((EVP_PKEY_CTX *)pBVar37);
LAB_00121888:
    init((EVP_PKEY_CTX *)pBVar37);
LAB_0012188d:
    init((EVP_PKEY_CTX *)pBVar37);
  }
  init((EVP_PKEY_CTX *)pBVar37);
LAB_00121897:
  init((EVP_PKEY_CTX *)pBVar37);
  pRVar39 = (RAAssignment *)(pBVar37->super_FuncPass).super_Pass._vptr_Pass;
  pBVar41 = unaff_R12;
  pRStack_58 = this;
  pBStack_50 = unaff_R12;
  if (*(int *)pRVar39[2]._physToWorkIds._data != 0) {
    pBVar41 = *(BaseRAPass **)&pRVar39[2]._layout.physTotal;
    lVar32 = *(long *)((pRVar39[2]._physToWorkMap)->assigned)._masks._data;
    uStack_68 = (ulong)*(byte *)&pBVar41->_extraBlock;
    pRStack_70 = (RAAssignment *)&pBVar37->field_0x48;
    uStack_78 = 0;
    uVar29 = 1;
    lStack_88 = lVar32;
    pBStack_80 = pBVar37;
    do {
      if (uStack_68 != 0) {
        pBStack_60 = (BaseRAPass *)0x0;
        unaff_RBP = 0;
        do {
          uVar60 = 4;
          unaff_R13 = pBStack_60;
          do {
            if (*(byte *)&pBVar41->_extraBlock <= (byte)unaff_RBP) {
              pRStack_98 = (RALocalAllocator *)0x121b57;
              makeInitialAssignment();
LAB_00121b57:
              pRStack_98 = (RALocalAllocator *)0x121b5c;
              makeInitialAssignment();
LAB_00121b5c:
              pRStack_98 = (RALocalAllocator *)0x121b61;
              makeInitialAssignment();
LAB_00121b61:
              pRStack_98 = (RALocalAllocator *)0x121b66;
              makeInitialAssignment();
LAB_00121b66:
              pRStack_98 = (RALocalAllocator *)0x121b6b;
              makeInitialAssignment();
LAB_00121b6b:
              pRStack_98 = (RALocalAllocator *)0x121b70;
              makeInitialAssignment();
              goto LAB_00121b70;
            }
            this = (RALocalAllocator *)(ulong)uVar29;
            uVar42 = uVar29;
            if (*(int *)(*(long *)(&pBVar41->field_0x300 + 0x48) + (long)unaff_R13 * 2) != 0) {
              pBVar7 = (pBVar37->super_FuncPass).super_Pass._cb;
              uVar35 = *(int *)(*(long *)(&pBVar41->field_0x300 + 0x48) + 4 + (long)unaff_R13 * 2) -
                       0x100;
              if ((uVar35 < *(uint *)&pBVar7[1].super_BaseEmitter._logger) &&
                 (pPVar20 = *(PhysToWorkMap **)
                             ((long)(&(pBVar7[1].super_BaseEmitter._code)->_environment)[uVar35] +
                             0x28), pPVar20 != (PhysToWorkMap *)0x0)) {
                uVar35 = (pPVar20->assigned)._masks._data[0];
                if (*(uint *)(lVar32 + 0x80) <= uVar35) goto LAB_00121b57;
                if ((*(ulong *)(*(long *)(lVar32 + 0x78) + (ulong)(uVar35 >> 6) * 8) >>
                     ((ulong)uVar35 & 0x3f) & 1) != 0) {
                  if (*(uint *)&pBVar37->field_0x54 <= uVar35) goto LAB_00121b5c;
                  if (*(char *)(*(long *)&pBVar37->field_0x60 + (ulong)uVar35) == -1) {
                    RVar14 = *(RegGroup *)((long)pPVar20->workIds + 1) & kMaxValue;
                    if (kExtraVirt3 < RVar14) goto LAB_00121b61;
                    ctx = (EVP_PKEY_CTX *)(ulong)RVar14;
                    uVar30 = ~*(uint *)(*(long *)&pBVar37->field_0x68 + (ulong)((uint)RVar14 * 4)) &
                             *(uint *)((long)(&pBVar37->_formatOptions + -10) +
                                      (ulong)((uint)RVar14 * 4) + 8);
                    if ((int)uStack_78 == 0) {
                      bVar28 = *(byte *)((long)pPVar20[2].assigned._masks._data + 2);
                      uStack_90 = (ulong)bVar28;
                      uVar42 = 2;
                      if ((bVar28 != 0xff) && ((uVar30 >> (bVar28 & 0x1f) & 1) != 0)) {
                        pRStack_98 = (RALocalAllocator *)0x121a49;
                        pRVar39 = pRStack_70;
                        RAAssignment::assign(pRStack_70,RVar14,uVar35,(uint)bVar28,true);
                        if (0x1f < unaff_RBP) goto LAB_00121b6b;
LAB_00121a53:
                        pRVar39 = (RAAssignment *)(pBStack_80->super_FuncPass).super_Pass._vptr_Pass
                        ;
                        *(uint *)((undefined1 *)((long)pRVar39[7]._physToWorkIds._data + 0xc) +
                                 (long)unaff_R13) =
                             (uint)*(byte *)(*(long *)((pPVar20->assigned)._masks._data + 2) + 0xd)
                             + ((int)uStack_90 << 0x10 | (pPVar20->workIds[0] & 0xf8) << 0x15) +
                             0x100;
                        pBVar37 = pBStack_80;
                        lVar32 = lStack_88;
                        uVar42 = uVar29;
                      }
                    }
                    else {
                      if (uVar30 != 0) {
                        uVar42 = 0;
                        if (uVar30 != 0) {
                          for (; (uVar30 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                          }
                        }
                        uStack_90 = (ulong)uVar42;
                        pRStack_98 = (RALocalAllocator *)0x121a05;
                        pRVar39 = pRStack_70;
                        RAAssignment::assign(pRStack_70,RVar14,uVar35,uVar42,true);
                        if (unaff_RBP < 0x20) goto LAB_00121a53;
                        goto LAB_00121b66;
                      }
                      if (*(long *)((pPVar20->dirty)._masks._data + 2) == 0) {
                        uVar29 = *(uint *)((long)pRVar39[6]._physToWorkIds._data + 4);
                        ctx = (EVP_PKEY_CTX *)(ulong)uVar29;
                        lVar32 = *(long *)((pPVar20->assigned)._masks._data + 2);
                        uStack_90 = CONCAT44(uStack_90._4_4_,1);
                        pRStack_98 = (RALocalAllocator *)0x121ad1;
                        pRVar24 = RAStackAllocator::newSlot
                                            ((RAStackAllocator *)(pRVar39 + 7),uVar29,
                                             *(uint32_t *)(lVar32 + 8),(uint)*(byte *)(lVar32 + 0xc)
                                             ,1);
                        *(RAStackSlot **)((pPVar20->dirty)._masks._data + 2) = pRVar24;
                        uVar29 = pPVar20[1].assigned._masks._data[0] | 0x100;
                        pPVar20[1].assigned._masks._data[0] = uVar29;
                        if (pRVar24 == (RAStackSlot *)0x0) goto LAB_00121b40;
                        pRVar39 = (RAAssignment *)(pBStack_80->super_FuncPass).super_Pass._vptr_Pass
                        ;
                        pBVar37 = pBStack_80;
                        lVar32 = lStack_88;
                      }
                      else {
                        uVar29 = pPVar20[1].assigned._masks._data[0];
                      }
                      pPVar20[1].assigned._masks._data[0] = uVar29 | 0x400;
                      ppuVar1 = pRVar39[0xe]._physToWorkIds._data + 3;
                      *(int *)ppuVar1 = *(int *)ppuVar1 + 1;
                    }
                  }
                }
              }
            }
            uVar29 = uVar42;
            unaff_R13 = (BaseRAPass *)((long)&(unaff_R13->super_FuncPass).super_Pass._vptr_Pass + 4)
            ;
            uVar60 = uVar60 - 1;
          } while (uVar60 != 0);
          unaff_RBP = unaff_RBP + 1;
          pBStack_60 = (BaseRAPass *)&(pBStack_60->super_FuncPass).super_Pass._name;
        } while (unaff_RBP != uStack_68);
      }
      uVar42 = (int)uStack_78 + 1;
      uStack_78 = (ulong)uVar42;
      if (uVar29 <= uVar42) {
        uStack_90 = 0;
LAB_00121b40:
        return (int)uStack_90;
      }
    } while( true );
  }
LAB_00121b70:
  pRStack_98 = (RALocalAllocator *)0x121b75;
  makeInitialAssignment();
  uStack_a0 = 0x121b8e;
  pRStack_98 = this;
  memcpy(pRVar39[1]._physToWorkMap,ctx,(ulong)pRVar39[1]._layout.physTotal * 4 + 0x20);
  uStack_a0 = 0x121b9f;
  memset(pRVar39[1]._workToPhysMap,0xff,(ulong)pRVar39[1]._layout.workCount);
  lVar32 = 0;
  _cStack_134 = 0xffffffff;
  while (uVar29 = ((pRVar39[1]._physToWorkMap)->assigned)._masks._data[lVar32], uVar29 == 0) {
LAB_00121bdf:
    lVar32 = lVar32 + 1;
    if (lVar32 == 4) {
      return 0;
    }
  }
  bVar28 = *(byte *)((long)pRVar39[1]._physToWorkIds._data + lVar32 + -0x28);
  pBVar37 = (BaseRAPass *)(ulong)bVar28;
  while( true ) {
    uVar42 = 0;
    if (uVar29 != 0) {
      for (; (uVar29 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
      }
    }
    pBVar40 = (BaseRAPass *)(ulong)uVar42;
    pBVar53 = (BaseRAPass *)(ulong)(uVar42 + bVar28);
    pBVar51 = (BaseRAPass *)(ulong)(pRVar39[1]._physToWorkMap)->workIds[(long)pBVar53];
    if (pBVar51 == (BaseRAPass *)0xffffffff) break;
    pRVar39[1]._workToPhysMap[(long)pBVar51].physIds[0] = (uint8_t)uVar42;
    uVar29 = uVar29 - 1 & uVar29;
    if (uVar29 == 0) goto LAB_00121bdf;
  }
  uStack_a0 = 0x121bf1;
  replaceAssignment();
  _cStack_164 = SUB84(pBVar51,0);
  apuStack_e8[2] = (uint *)0x0;
  apuStack_e8[3] = (uint *)0x0;
  apuStack_e8[0] = (uint *)0x0;
  apuStack_e8[1] = (uint *)0x0;
  pBVar52 = (BaseRAPass *)(pBVar40->super_FuncPass).super_Pass._vptr_Pass;
  bVar28 = (pBVar52->_physRegCount).field_0._regs[0];
  uVar29 = (uint)(pBVar52->_physRegCount).field_0._regs[1] + (uint)bVar28;
  pBVar43 = pBVar37;
  pRStack_c8 = pRVar39;
  pBStack_c0 = pBVar41;
  pBStack_b8 = unaff_R13;
  uStack_b0 = uVar60;
  pPStack_a8 = pPVar20;
  uStack_a0 = unaff_RBP;
  if (0xff < uVar29) goto LAB_00122384;
  uVar42 = (pBVar52->_physRegCount).field_0._regs[2] + uVar29;
  pBStack_1a0 = pBVar37;
  if (0xff < uVar42) goto LAB_00122389;
  pRStack_160 = (RAAssignment *)&pBVar40->field_0x48;
  pRStack_100 = &pBVar52->_workRegs;
  aStack_110._packed = uVar42 * 0x1000000 | uVar29 * 0x10000 | (uint)bVar28 << 8;
  uStack_10c = (pBVar52->_physRegCount).field_0._packed;
  iStack_108 = (uStack_10c >> 0x18) + uVar42;
  uStack_104 = *(uint *)&pBVar52->field_0x148;
  uVar23 = (ulong)uStack_104;
  pPVar20 = (PhysToWorkMap *)pBVar40->_lastTimestamp;
  lVar32 = 0;
  do {
    *(uint **)((long)apuStack_e8 + lVar32) =
         (((RARegMask *)&pBVar37->_allocator)->_masks)._data +
         (ulong)(aStack_110._packed >> ((byte)lVar32 & 0x1f) & 0xff) + 2;
    lVar32 = lVar32 + 8;
  } while (lVar32 != 0x20);
  pBVar43 = (BaseRAPass *)0xff;
  pcStack_188 = (code *)0x121cf2;
  pBStack_180 = pBVar40;
  plStack_148 = extraout_RDX;
  pPStack_f8 = pPVar20;
  pBStack_f0 = pBVar37;
  memset(pPVar20,0xff,uVar23);
  lVar32 = 0;
  do {
    uVar29 = (((RARegMask *)&pBVar37->_allocator)->_masks)._data[lVar32 + -6];
    if (uVar29 != 0) {
      bVar28 = aStack_110._regs[lVar32];
      pBVar43 = (BaseRAPass *)(ulong)bVar28;
      while( true ) {
        iVar16 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> iVar16 & 1) == 0; iVar16 = iVar16 + 1) {
          }
        }
        uVar50 = (ulong)(((RARegMask *)&pBVar37->_allocator)->_masks)._data
                        [(ulong)(iVar16 + (uint)bVar28) + 2];
        if (uVar50 == 0xffffffff) break;
        *(char *)((long)(pPVar20->assigned)._masks._data + uVar50) = (char)iVar16;
        uVar29 = uVar29 - 1 & uVar29;
        if (uVar29 == 0) goto LAB_00121d2a;
      }
      pcStack_188 = (code *)0x122331;
      switchToAssignment();
LAB_00122331:
      pcStack_188 = (code *)0x122336;
      switchToAssignment();
LAB_00122336:
      pcStack_188 = (code *)0x12233b;
      switchToAssignment();
LAB_0012233b:
      pcStack_188 = (code *)0x122340;
      switchToAssignment();
LAB_00122340:
      pcStack_188 = (code *)0x122345;
      switchToAssignment();
LAB_00122345:
      pcStack_188 = (code *)0x12234a;
      switchToAssignment();
LAB_0012234a:
      pcStack_188 = (code *)0x12234f;
      switchToAssignment();
LAB_0012234f:
      pcStack_188 = (code *)0x122354;
      switchToAssignment();
LAB_00122354:
      pcStack_188 = (code *)0x122359;
      switchToAssignment();
LAB_00122359:
      pcStack_188 = (code *)0x12235e;
      switchToAssignment();
LAB_0012235e:
      pcStack_188 = (code *)0x122363;
      switchToAssignment();
      return 3;
    }
LAB_00121d2a:
    lVar32 = lVar32 + 1;
  } while (lVar32 != 4);
  ppAStack_120 = (ArchTraits **)&(pBVar37->super_FuncPass).super_Pass._name;
  pBVar52 = (BaseRAPass *)0x0;
  pBStack_150 = pBVar37;
  uStack_128 = uVar23;
  pPStack_118 = pPVar20;
  pBVar51 = pBStack_180;
  do {
    unaff_RBP = uStack_128;
    pBVar41 = pBStack_150;
    pBStack_170 = pBVar52;
    if ((cStack_164 == '\0') &&
       (uVar29 = (((RAAssignment *)&pBVar51->field_0x48)->_physToWorkMap->assigned)._masks._data
                 [(long)pBVar52], pBVar53 = pBVar52, uVar29 != 0)) {
      while( true ) {
        pRVar39 = (RAAssignment *)(ulong)uVar29;
        pBVar40 = (BaseRAPass *)0xffffffff;
        uVar42 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
          }
        }
        pPVar20 = (PhysToWorkMap *)(ulong)uVar42;
        uVar35 = (((RAAssignment *)&pBVar51->field_0x48)->_physToWorkIds)._data[(long)pBVar53]
                 [(long)pPVar20];
        unaff_R13 = (BaseRAPass *)(ulong)uVar35;
        if (unaff_R13 == (BaseRAPass *)0xffffffff) goto LAB_00122359;
        if (*(uint *)(plStack_148 + 1) <= uVar35) goto LAB_0012235e;
        if ((*(ulong *)(*plStack_148 + (ulong)(uVar35 >> 6) * 8) >> ((ulong)unaff_R13 & 0x3f) & 1)
            != 0) break;
LAB_00121df3:
        pBVar43 = (BaseRAPass *)((ulong)pBVar53 & 0xff);
        pcStack_188 = (code *)0x121e07;
        RAAssignment::unassign(pRStack_160,(RegGroup)pBVar53,uVar35,uVar42);
        pBVar51 = pBStack_180;
        pBVar52 = pBStack_170;
LAB_00121e15:
        uVar29 = uVar29 - 1 & uVar29;
        pBVar53 = pBVar52;
        if (uVar29 == 0) goto LAB_00121e22;
      }
      if (uVar35 < (uint)unaff_RBP) {
        pBVar52 = pBVar53;
        if (((BaseNode *)((long)(pPStack_118->assigned)._masks._data + (long)unaff_R13))->field_0x0
            == 0xff) {
          if (((((RAAssignment *)&pBVar51->field_0x48)->_physToWorkMap->dirty)._masks._data
               [(long)pBVar53] >> (uVar42 & 0x1f) & 1) != 0) {
            pcStack_188 = (code *)0x121de6;
            EVar15 = onSaveReg((RALocalAllocator *)pBVar51,(RegGroup)pBVar53,uVar35,uVar42);
            pBVar53 = pBStack_170;
            if (EVar15 != 0) {
              return EVar15;
            }
          }
          goto LAB_00121df3;
        }
        goto LAB_00121e15;
      }
      pcStack_188 = (code *)0x122370;
      switchToAssignment();
LAB_00122370:
      pcStack_188 = (code *)0x122375;
      switchToAssignment();
LAB_00122375:
      pcStack_188 = (code *)0x12237a;
      switchToAssignment();
LAB_0012237a:
      pcStack_188 = (code *)0x12237f;
      switchToAssignment();
      break;
    }
LAB_00121e22:
    uVar29 = (((RARegMask *)&pBVar41->_allocator)->_masks)._data
             [(long)(&pBVar52[-1].field_0x3b0 + 0xfa)];
    pBVar53 = pBVar52;
    if (uVar29 != 0) {
      puVar55 = (uint *)((long)ppAStack_120 + (long)pBVar52 * 4);
      iVar16 = -1;
      puStack_158 = puVar55;
      pBVar43 = (BaseRAPass *)0x0;
      do {
        iVar16 = iVar16 + 1;
        if (iVar16 == 2) {
          if (cStack_164 == '\0') {
            return 3;
          }
          break;
        }
        pBStack_140 = pBVar43;
        puStack_130 = apuStack_e8[(long)pBVar52];
        pBVar41 = (BaseRAPass *)(ulong)uVar29;
        do {
          uVar42 = 0;
          uVar35 = (uint)pBVar41;
          if (uVar35 != 0) {
            for (; (uVar35 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar38 = 1 << ((byte)uVar42 & 0x1f);
          uVar30 = *(uint *)((long)puStack_130 + (ulong)(uVar42 * 4));
          pPVar20 = (PhysToWorkMap *)(ulong)uVar30;
          if (pPVar20 == (PhysToWorkMap *)0xffffffff) goto LAB_00122331;
          uVar54 = *(uint *)((long)(((RAAssignment *)&pBVar51->field_0x48)->_physToWorkIds)._data
                                   [(long)pBVar52] + (ulong)(uVar42 * 4));
          unaff_R13 = (BaseRAPass *)(ulong)uVar54;
          if (uVar54 == 0xffffffff) {
LAB_00121ff6:
            if ((((RAAssignment *)&pBVar51->field_0x48)->_layout).workCount <= uVar30)
            goto LAB_00122340;
            bVar28 = ((WorkToPhysMap *)
                     ((long)(pPVar20->assigned)._masks._data +
                     (long)((RAAssignment *)&pBVar51->field_0x48)->_workToPhysMap))->physIds[0];
            uVar60 = (ulong)bVar28;
            if (bVar28 == 0xff) {
              if (*(uint *)(plStack_148 + 1) <= uVar30) goto LAB_0012234f;
              uVar42 = uVar38;
              if ((*(ulong *)(*plStack_148 + (ulong)(uVar30 >> 6) * 8) >> ((ulong)pPVar20 & 0x3f) &
                  1) == 0) {
                uVar42 = 0;
              }
              pBStack_140 = (BaseRAPass *)(ulong)((uint)pBStack_140 | uVar42);
              uVar29 = uVar29 & ~uVar38;
            }
            else {
              if (uVar42 != bVar28) {
                unaff_R13 = (BaseRAPass *)(ulong)uVar29;
                pcStack_188 = (code *)0x122034;
                RAAssignment::reassign(pRStack_160,(RegGroup)pBVar52,uVar30,uVar42,(uint)bVar28);
                pBVar37 = (BaseRAPass *)(pBStack_180->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_188 = (code *)0x122049;
                iVar16 = (*(pBVar37->super_FuncPass).super_Pass._vptr_Pass[9])
                                   (pBVar37,(ulong)uVar30,(ulong)uVar42,(ulong)bVar28);
LAB_00122051:
                pBVar51 = pBStack_180;
                pBVar52 = pBStack_170;
                puVar55 = puStack_158;
                if (iVar16 != 0) {
                  return iVar16;
                }
              }
LAB_00122067:
              uVar54 = *puVar55;
              pPVar22 = ((RAAssignment *)&pBVar51->field_0x48)->_physToWorkMap;
              uVar31 = (pPVar22->dirty)._masks._data[(long)pBVar52];
              if (((uVar31 ^ uVar54) & uVar38) != 0) {
                if ((uVar54 & uVar38) == 0) {
                  if ((uVar31 & uVar38) == 0) goto LAB_00122354;
                  puVar36 = puVar55;
                  if (cStack_134 != '\0') {
                    uVar60 = (ulong)uVar29;
                    pcStack_188 = (code *)0x122100;
                    EVar15 = onSaveReg((RALocalAllocator *)pBVar51,(RegGroup)pBVar52,uVar30,uVar42);
                    pBVar51 = pBStack_180;
                    pBVar52 = pBStack_170;
                    puVar55 = puStack_158;
                    if (EVar15 != 0) {
                      return EVar15;
                    }
                    goto LAB_00122123;
                  }
                }
                else {
                  if ((uVar31 & uVar38) != 0) goto LAB_00122345;
                  puVar36 = (pPVar22->dirty)._masks._data + (long)pBVar52;
                  uVar54 = uVar31;
                }
                *puVar36 = uVar54 | uVar38;
              }
LAB_00122123:
              if (*(int *)((long)puStack_130 + (ulong)(uVar42 << 2)) !=
                  *(int *)((long)(((RAAssignment *)&pBVar51->field_0x48)->_physToWorkIds)._data
                                 [(long)pBVar52] + (ulong)(uVar42 << 2))) goto LAB_00122336;
              if (((*puVar55 & uVar38) != 0) !=
                  (((((RAAssignment *)&pBVar51->field_0x48)->_physToWorkMap->dirty)._masks._data
                    [(long)pBVar52] & uVar38) != 0)) goto LAB_0012233b;
              uVar29 = uVar29 & ~uVar38;
              iVar16 = -1;
            }
          }
          else {
            if (uVar54 == uVar30) goto LAB_00122067;
            if (0 < iVar16) {
              if ((((RAAssignment *)&pBVar51->field_0x48)->_layout).workCount <= uVar30)
              goto LAB_0012234a;
              bVar28 = ((RAAssignment *)&pBVar51->field_0x48)->_workToPhysMap[(long)pPVar20].physIds
                       [0];
              uVar60 = (ulong)bVar28;
              if (bVar28 != 0xff) {
                RVar14 = (RegGroup)pBVar52;
                if (((((ArchTraits *)(pBVar51->super_FuncPass).super_Pass._name)->_instHints)._data
                     [(long)pBVar52] & kRegSwap) == kNoHints) {
                  pPVar22 = ((RAAssignment *)&pBVar51->field_0x48)->_physToWorkMap;
                  if (((pPVar22->dirty)._masks._data[(long)pBVar52] & uVar38) == 0) {
                    pcStack_188 = (code *)0x121fdb;
                    RAAssignment::unassign(pRStack_160,RVar14,uVar54,uVar42);
                    pBVar51 = pBStack_180;
                    pBVar52 = pBStack_170;
                    puVar55 = puStack_158;
                  }
                  else {
                    uVar17 = ~(pPVar22->assigned)._masks._data[(long)pBVar52] &
                             (((BaseRAPass *)(pBVar51->super_FuncPass).super_Pass._vptr_Pass)->
                             _availableRegs)._masks._data[(long)pBVar52];
                    uVar31 = ~(((RARegMask *)&pBStack_150->_allocator)->_masks)._data
                              [(long)(&pBVar52[-1].field_0x3b0 + 0xfa)] & uVar17;
                    if ((uVar31 == 0) && (uVar31 = uVar17, uVar17 == 0)) {
                      uStack_138 = (uint)pBVar52 & 0xff;
                      pcStack_188 = (code *)0x12218d;
                      uStack_174 = uVar29;
                      EVar15 = onSaveReg((RALocalAllocator *)pBVar51,RVar14,uVar54,uVar42);
                      if (EVar15 != 0) {
                        return EVar15;
                      }
                      pcStack_188 = (code *)0x1221a8;
                      RAAssignment::unassign(pRStack_160,(RegGroup)uStack_138,uVar54,uVar42);
                      iVar16 = -1;
                      pBVar51 = pBStack_180;
                      pBVar52 = pBStack_170;
                      puVar55 = puStack_158;
                      uVar29 = uStack_174;
                      goto LAB_00121ff6;
                    }
                    uVar17 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    if (uVar17 != uVar42) {
                      pcStack_188 = (code *)0x121f3a;
                      uStack_174 = uVar29;
                      RAAssignment::reassign(pRStack_160,RVar14,uVar54,uVar17,uVar42);
                      pBVar37 = (BaseRAPass *)(pBStack_180->super_FuncPass).super_Pass._vptr_Pass;
                      pcStack_188 = (code *)0x121f4f;
                      iVar16 = (*(pBVar37->super_FuncPass).super_Pass._vptr_Pass[9])
                                         (pBVar37,unaff_R13,(ulong)uVar17,(ulong)uVar42);
                      pBVar51 = pBStack_180;
                      pBVar52 = pBStack_170;
                      puVar55 = puStack_158;
                      uVar29 = uStack_174;
                      if (iVar16 != 0) {
                        return iVar16;
                      }
                    }
                    puVar36 = (((RARegMask *)&pBVar51->field_0x28)->_masks)._data + (long)pBVar52;
                    *puVar36 = *puVar36 | 1 << ((byte)uVar17 & 0x1f);
                  }
                  iVar16 = -1;
                  goto LAB_00121ff6;
                }
                pcStack_188 = (code *)0x121f9e;
                uStack_174 = uVar29;
                RAAssignment::swap(pRStack_160,RVar14,uVar54,uVar42,uVar30,(uint)bVar28);
                pBVar37 = (BaseRAPass *)(pBStack_180->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_188 = (code *)0x121fb6;
                iVar16 = (*(pBVar37->super_FuncPass).super_Pass._vptr_Pass[10])
                                   (pBVar37,unaff_R13,(ulong)uVar42,pPVar20,uVar60);
                uVar29 = uStack_174;
                goto LAB_00122051;
              }
            }
          }
          uVar35 = uVar35 - 1 & uVar35;
          pBVar41 = (BaseRAPass *)(ulong)uVar35;
        } while (uVar35 != 0);
        pBVar43 = pBStack_140;
      } while (uVar29 != 0);
      pBVar53 = pBVar52;
      if ((int)pBVar43 != 0) {
        pPVar22 = ((RAAssignment *)&pBVar51->field_0x48)->_physToWorkMap;
        unaff_RBP = (ulong)pBVar52 & 0xff;
        do {
          pBVar40 = (BaseRAPass *)0xffffffff;
          uVar29 = 0;
          uVar42 = (uint)pBVar43;
          if (uVar42 != 0) {
            for (; (uVar42 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
            }
          }
          uVar60 = (ulong)uVar29;
          uVar35 = 1 << ((byte)uVar29 & 0x1f);
          pRVar39 = (RAAssignment *)(ulong)uVar35;
          if (((pPVar22->assigned)._masks._data[(long)pBVar53] >> (uVar29 & 0x1f) & 1) != 0) {
            if (cStack_164 != '\0') goto LAB_001222ce;
            goto LAB_00122370;
          }
          uVar30 = apuStack_e8[(long)pBVar53][uVar60];
          pPVar20 = (PhysToWorkMap *)(ulong)uVar30;
          if (*(uint *)(plStack_148 + 1) <= uVar30) goto LAB_00122375;
          if ((*(ulong *)(*plStack_148 + (ulong)(uVar30 >> 6) * 8) >> ((ulong)pPVar20 & 0x3f) & 1)
              == 0) goto LAB_0012237a;
          pcStack_188 = (code *)0x12226d;
          RAAssignment::assign(pRStack_160,(RegGroup)pBVar52,uVar30,uVar29,false);
          pBVar37 = (BaseRAPass *)(pBVar51->super_FuncPass).super_Pass._vptr_Pass;
          pcStack_188 = (code *)0x12227d;
          iVar16 = (*(pBVar37->super_FuncPass).super_Pass._vptr_Pass[0xb])
                             (pBVar37,(ulong)uVar30,(ulong)uVar29);
          if (iVar16 != 0) {
            return iVar16;
          }
          pPVar22 = ((RAAssignment *)&pBVar51->field_0x48)->_physToWorkMap;
          uVar29 = (pPVar22->dirty)._masks._data[(long)pBStack_170];
          pBVar41 = pBVar51;
          pBVar53 = pBStack_170;
          unaff_R13 = pBVar43;
          if ((*(uint *)((long)(&pBStack_150->_formatOptions + -10) + (long)pBStack_170 * 4) &
              uVar35) == 0) {
            pBVar40 = (BaseRAPass *)0xffffffff;
            if ((uVar29 & uVar35) != 0) goto LAB_0012237f;
          }
          else {
            (pPVar22->dirty)._masks._data[(long)pBStack_170] = uVar29 | uVar35;
            pBVar40 = (BaseRAPass *)0xffffffff;
            if ((*(uint *)((long)(&pBStack_150->_formatOptions + -10) + (long)pBStack_170 * 4) &
                uVar35) == 0) goto LAB_0012237f;
          }
LAB_001222ce:
          uVar42 = uVar42 - 1 & uVar42;
          pBVar43 = (BaseRAPass *)(ulong)uVar42;
        } while (uVar42 != 0);
      }
    }
    pBVar52 = (BaseRAPass *)((long)&(pBVar53->super_FuncPass).super_Pass._vptr_Pass + 1);
    if (pBVar52 == (BaseRAPass *)0x4) {
      iVar16 = 0;
      if (cStack_164 == '\0') {
        pcStack_188 = (code *)0x12230b;
        bVar65 = RAAssignment::equals((RAAssignment *)&aStack_110,pRStack_160);
        if (!bVar65) {
          pcStack_188 = (code *)0x122314;
          switchToAssignment();
          iVar16 = extraout_EAX;
        }
      }
      return iVar16;
    }
  } while( true );
LAB_0012237f:
  pcStack_188 = (code *)0x122384;
  switchToAssignment();
LAB_00122384:
  uVar42 = (uint)pBVar43;
  pcStack_188 = (code *)0x122389;
  switchToAssignment();
  pBStack_1a0 = pBVar41;
LAB_00122389:
  pcStack_188 = spillScratchGpRegsBeforeEntry;
  switchToAssignment();
  if (uVar42 == 0) {
    return 0;
  }
  this_00 = (RAAssignment *)&pBVar40->field_0x48;
  pBVar37 = pBVar40;
  pRStack_1a8 = pRVar39;
  uStack_198 = uVar60;
  pPStack_190 = pPVar20;
  pcStack_188 = (code *)unaff_RBP;
  do {
    uVar29 = 0;
    if (uVar42 != 0) {
      for (; (uVar42 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
      }
    }
    pBVar41 = (BaseRAPass *)(ulong)uVar29;
    pPVar20 = ((RAAssignment *)&pBVar40->field_0x48)->_physToWorkMap;
    uVar35 = 1 << ((byte)uVar29 & 0x1f);
    if (((pPVar20->assigned)._masks._data[0] >> (uVar29 & 0x1f) & 1) != 0) {
      pIVar44 = (InstNode *)(ulong)uVar29;
      uVar30 = (((RAAssignment *)&pBVar40->field_0x48)->_physToWorkIds)._data[0][(long)pIVar44];
      pBVar52 = (BaseRAPass *)(ulong)uVar30;
      uVar38 = (pPVar20->dirty)._masks._data[0];
      if ((uVar38 & uVar35) != 0) {
        if (uVar30 == 0xffffffff) {
          pBStack_1b0 = (BaseRAPass *)0x12242e;
          spillScratchGpRegsBeforeEntry();
LAB_0012242e:
          pBStack_1b0 = (BaseRAPass *)0x122433;
          spillScratchGpRegsBeforeEntry();
        }
        else {
          if ((((RAAssignment *)&pBVar40->field_0x48)->_layout).workCount <= uVar30)
          goto LAB_0012242e;
          bVar28 = *(uint8_t *)
                    ((long)&(pBVar52->super_FuncPass).super_Pass._vptr_Pass +
                    (long)((RAAssignment *)&pBVar40->field_0x48)->_workToPhysMap);
          pIVar44 = (InstNode *)(ulong)bVar28;
          if (uVar29 == bVar28) {
            (pPVar20->dirty)._masks._data[0] = uVar38 & ~uVar35;
            pBVar37 = (BaseRAPass *)(pBVar40->super_FuncPass).super_Pass._vptr_Pass;
            pBStack_1b0 = (BaseRAPass *)0x1223ff;
            iVar16 = (*(pBVar37->super_FuncPass).super_Pass._vptr_Pass[0xc])
                               (pBVar37,pBVar52,(ulong)uVar29);
            if (iVar16 != 0) {
              return iVar16;
            }
            goto LAB_00122403;
          }
        }
        pBStack_1b0 = (BaseRAPass *)allocInst;
        spillScratchGpRegsBeforeEntry();
        pBStack_1b0 = pBVar41;
        pRStack_1b8 = this_00;
        uStack_1c0 = (ulong)uVar42;
        pBStack_1c8 = unaff_R13;
        pBStack_1d0 = pBVar52;
        pBStack_1d8 = pBVar40;
        pBVar43 = *(BaseRAPass **)(pIVar44 + 0x20);
        (((BaseCompiler *)(pBVar37->super_FuncPass).super_Pass._cb)->super_BaseBuilder)._cursor =
             *(BaseNode **)pIVar44;
        *(InstNode **)&pBVar37->_instructionCount = pIVar44;
        *(BaseRAPass **)&pBVar37->_sharedAssignments = pBVar43;
        *(uint32_t *)&pBVar37->field_0xf0 = *(uint32_t *)&(pBVar43->super_FuncPass).super_Pass._name
        ;
        ((RARegCount *)&pBVar37->field_0xf4)->field_0 =
             (anon_union_4_2_ebeb14a8_for_RARegCount_0)
             (((RARegMask *)&pBVar43->_allocator)->_masks)._data[0];
        pBStack_488 = (BaseRAPass *)&pBVar37->field_0x48;
        auStack_420._56_8_ = pIVar44 + 0x40;
        pBVar63 = (BaseRAPass *)0x0;
        uStack_428 = 0;
        pBStack_4c0 = pBVar37;
        pIStack_440 = pIVar44;
        pBStack_430 = pBVar43;
        break;
      }
LAB_00122403:
      pBStack_1b0 = (BaseRAPass *)0x122412;
      pBVar37 = (BaseRAPass *)this_00;
      RAAssignment::unassign(this_00,k0,uVar30,uVar29);
    }
    uVar42 = uVar42 - 1 & uVar42;
    if (uVar42 == 0) {
      return 0;
    }
  } while( true );
LAB_001224bb:
  bVar28 = (char)pBVar63 * '\b';
  pBVar46 = *(BaseRAPass **)&pBVar37->_sharedAssignments;
  uVar29 = *(uint *)((long)&(pBVar46->super_FuncPass).super_Pass._name + 4) >> (bVar28 & 0x1f);
  pBVar25 = (BaseRAPass *)(ulong)uVar29;
  uStack_4ac = (((RARegMask *)&pBVar46->field_0x28)->_masks)._data
               [(long)((long)&(pBVar63->super_FuncPass).super_Pass._vptr_Pass + 1)];
  uStack_47c = (((RARegMask *)&pBVar46->field_0x38)->_masks)._data
               [(long)((long)&(pBVar63->super_FuncPass).super_Pass._vptr_Pass + 1)];
  pBVar34 = (BaseRAPass *)(ulong)uStack_47c;
  cStack_49d = '\x01';
  uVar42 = (((RARegCount *)&pBVar37->field_0xf4)->field_0)._packed >> (bVar28 & 0x1f) & 0xff;
  pBVar61 = (BaseRAPass *)(ulong)uVar42;
  pBVar58 = pBVar37;
  pBStack_4b8 = pBVar63;
  if (uVar42 == 0) {
    pBStack_470 = (BaseRAPass *)0x0;
    uStack_44c = 0;
    pBStack_468 = (BaseRAPass *)0x0;
    uStack_49c = 0;
    pBVar62 = (BaseRAPass *)(ulong)uStack_47c;
    cVar66 = cStack_49d;
LAB_00123209:
    cStack_49d = cVar66;
    uVar29 = (uint)pBVar62;
    pBVar33 = pBVar34;
    pBVar47 = pBVar46;
    pBVar61 = pBVar62;
    while (uVar29 != 0) {
      uVar42 = 0;
      uVar29 = (uint)pBVar61;
      if (uVar29 != 0) {
        for (; (uVar29 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
        }
      }
      pBVar40 = (BaseRAPass *)(ulong)uVar42;
      uVar35 = (((RAAssignment *)&pBVar58->field_0x48)->_physToWorkIds)._data[(long)pBVar63]
               [(long)pBVar40];
      pBVar41 = (BaseRAPass *)(ulong)uVar35;
      if (uVar35 != 0xffffffff) {
        if (((((RAAssignment *)&pBVar58->field_0x48)->_physToWorkMap->dirty)._masks._data
             [(long)pBVar63] >> (uVar42 & 0x1f) & 1) != 0) {
          pcStack_4c8 = (code *)0x12323d;
          EVar15 = onSaveReg((RALocalAllocator *)pBVar58,(RegGroup)pBVar63,uVar35,uVar42);
          if (EVar15 != 0) {
            return EVar15;
          }
        }
        pBVar47 = (BaseRAPass *)((ulong)pBVar63 & 0xff);
        pcStack_4c8 = (code *)0x123257;
        pBVar33 = pBVar40;
        pBVar25 = pBStack_488;
        RAAssignment::unassign((RAAssignment *)pBStack_488,(RegGroup)pBVar63,uVar35,uVar42);
        pBVar43 = extraout_RDX_01;
      }
      uVar29 = uVar29 - 1 & uVar29;
      pBVar61 = (BaseRAPass *)(ulong)uVar29;
    }
    if (uStack_44c != 0) {
      pBVar61 = (BaseRAPass *)(ulong)uStack_44c;
      pBVar37 = (BaseRAPass *)0x0;
      do {
        puVar55 = (uint *)auStack_2e0[(long)pBVar37];
        pBVar52 = (BaseRAPass *)(ulong)puVar55[4];
        if (puVar55[4] != 0) {
          uVar29 = *puVar55;
          pBVar40 = (BaseRAPass *)(ulong)uVar29;
          bVar28 = *(byte *)((long)puVar55 + 0xe);
          pBVar41 = (BaseRAPass *)(ulong)bVar28;
          do {
            uVar42 = 0;
            uVar35 = (uint)pBVar52;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
              }
            }
            pBVar43 = (BaseRAPass *)(ulong)uVar42;
            if (uVar42 != bVar28) {
              pBVar25 = *(BaseRAPass **)&pBVar58->super_FuncPass;
              pBVar47 = (BaseRAPass *)(ulong)uVar29;
              pBVar33 = (BaseRAPass *)(ulong)(uint)bVar28;
              pcStack_4c8 = (code *)0x12329e;
              (**(code **)&((BaseRAPass *)(pBVar25->super_FuncPass).super_Pass._vptr_Pass)->
                           field_0x48)();
              pBVar43 = extraout_RDX_02;
            }
            uVar35 = uVar35 - 1 & uVar35;
            pBVar52 = (BaseRAPass *)(ulong)uVar35;
          } while (uVar35 != 0);
        }
        pBVar37 = (BaseRAPass *)((long)&(pBVar37->super_FuncPass).super_Pass._vptr_Pass + 1);
      } while (pBVar37 != pBVar61);
    }
    if (((pBStack_4b8 == (BaseRAPass *)0x1) && (pIStack_440[0x10] == (InstNode)0x12)) &&
       (uVar29 = *(uint *)(*(long *)(&pBVar58->field_0x48 + 0x20) + 4) &
                 *(uint *)(pIStack_440 + 0xa8), pBVar61 = (BaseRAPass *)(ulong)uVar29, uVar29 != 0))
    {
      IVar6 = pIStack_440[0x8d];
      pBVar41 = (BaseRAPass *)(ulong)(byte)IVar6;
      while( true ) {
        uVar29 = 0;
        uVar42 = (uint)pBVar61;
        if (uVar42 != 0) {
          for (; (uVar42 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        pBVar40 = (BaseRAPass *)(ulong)uVar29;
        pp_Var56 = (pBVar58->super_FuncPass).super_Pass._vptr_Pass;
        pBVar33 = *(BaseRAPass **)(&pBVar58->field_0x48 + 0x30);
        uVar35 = (((RARegMask *)&pBVar33->_allocator)->_masks)._data
                 [(long)(&pBVar40[-1].field_0x3b0 + 0xfa)];
        pBVar63 = (BaseRAPass *)(ulong)uVar35;
        pBVar48 = pBVar47;
        if (*(uint *)(pp_Var56 + 0x29) <= uVar35) break;
        if ((uint)(byte)IVar6 <
            *(uint *)(*(long *)(*(long *)(pp_Var56[0x28] + (long)pBVar63 * 8) + 8) + 8)) {
          if ((*(uint *)(*(long *)(&pBVar58->field_0x48 + 0x20) + 0x14) >> (uVar29 & 0x1f) & 1) != 0
             ) {
            pcStack_4c8 = (code *)0x12334c;
            EVar15 = onSaveReg((RALocalAllocator *)pBVar58,kVec,uVar35,uVar29);
            if (EVar15 != 0) {
              return EVar15;
            }
          }
          pBVar47 = (BaseRAPass *)0x1;
          pcStack_4c8 = (code *)0x123368;
          pBVar33 = pBVar40;
          pBVar25 = pBStack_488;
          RAAssignment::unassign((RAAssignment *)pBStack_488,kVec,uVar35,uVar29);
          pBVar43 = extraout_RDX_03;
        }
        uVar42 = uVar42 - 1 & uVar42;
        pBVar61 = (BaseRAPass *)(ulong)uVar42;
        if (uVar42 == 0) goto LAB_00123374;
      }
LAB_001236fd:
      pcStack_4c8 = (code *)0x123702;
      allocInst();
LAB_00123702:
      pcStack_4c8 = (code *)0x123707;
      allocInst();
LAB_00123707:
      pcStack_4c8 = (code *)0x12370c;
      allocInst();
      pBVar45 = pBVar48;
      pBVar37 = pBVar58;
LAB_0012370c:
      pcStack_4c8 = (code *)0x123711;
      allocInst();
LAB_00123711:
      pcStack_4c8 = (code *)0x123716;
      allocInst();
LAB_00123716:
      pcStack_4c8 = (code *)0x12371b;
      allocInst();
      pBVar58 = pBVar37;
LAB_0012371b:
      pcStack_4c8 = (code *)0x123720;
      allocInst();
      pBVar48 = pBVar45;
      goto LAB_00123720;
    }
LAB_00123374:
    uStack_47c = uStack_47c | uStack_4ac;
    if (uStack_49c != 0) {
      pBStack_498 = (BaseRAPass *)
                    CONCAT44(pBStack_498._4_4_,
                             *(undefined4 *)
                              (*(long *)(&pBVar58->field_0x48 + 0x20) + (long)pBStack_4b8 * 4));
      if (((int)pBStack_468 != 0) &&
         (((ulong)(((FuncPass *)auStack_420._16_8_)->super_Pass)._cb & 0x800) != 0)) {
        uVar29 = *(uint *)((long)&(((FuncPass *)auStack_420._16_8_)->super_Pass)._name + 4);
        if (uVar29 == 0) {
          return 0x3d;
        }
        pZVar13 = &pBVar58->_allocator;
        pp_Var56 = (pBVar58->super_FuncPass).super_Pass._vptr_Pass;
        pBVar33 = (BaseRAPass *)((ulong)pBStack_468 & 0xffffffff);
        pBVar58 = (BaseRAPass *)(ulong)(uint)((int)pBStack_468 << 3);
        pBVar53 = (BaseRAPass *)0x0;
        pBVar51 = (BaseRAPass *)0xffffffff;
        uVar42 = uVar29;
        do {
          uVar35 = 0;
          if (uVar42 != 0) {
            for (; (uVar42 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
            }
          }
          if ((uVar29 >> (uVar35 & 0x1f) & 1) != 0) {
            pBVar61 = (BaseRAPass *)(ulong)uVar35;
            pBVar40 = (BaseRAPass *)0xf;
            lVar32 = 0;
            do {
              if ((*(uint *)(pZVar13 + (long)pBStack_4b8 * 4) >> ((uint)pBVar61 & 0x1f) & 1) == 0) {
                pBVar40 = (BaseRAPass *)0x0;
                break;
              }
              if (*(uint *)(pp_Var56 + 0x29) <= **(uint **)(auStack_420 + lVar32 + 0x10)) {
LAB_00123696:
                pcStack_4c8 = (code *)0x12369b;
                allocInst();
                return 0x3d;
              }
              pBVar52 = (BaseRAPass *)
                        (ulong)*(byte *)(*(long *)(pp_Var56[0x28] +
                                                  (ulong)**(uint **)(auStack_420 + lVar32 + 0x10) *
                                                  8) + 0x4a);
              pBVar41 = (BaseRAPass *)(ulong)(pBVar61 == pBVar52);
              pBVar40 = (BaseRAPass *)(ulong)((int)pBVar40 + (uint)(pBVar61 == pBVar52));
              lVar32 = lVar32 + 8;
              pBVar61 = (BaseRAPass *)((long)&(pBVar61->super_FuncPass).super_Pass._vptr_Pass + 1);
            } while (pBVar58 != (BaseRAPass *)lVar32);
            if ((uint)pBVar53 < (uint)pBVar40) {
              pBVar51 = (BaseRAPass *)(ulong)uVar35;
              pBVar53 = pBVar40;
            }
          }
          uVar42 = uVar42 - 1 & uVar42;
        } while (uVar42 != 0);
        if ((int)pBVar51 == -1) {
          return 0x3d;
        }
        pBVar43 = (BaseRAPass *)0x0;
        do {
          pBVar47 = (BaseRAPass *)alStack_3e0[(long)&pBVar43[-1].field_0x4aa];
          uVar29 = (int)pBVar51 + (int)pBVar43;
          pBVar25 = (BaseRAPass *)(ulong)uVar29;
          *(char *)((long)&(pBVar47->super_FuncPass).super_Pass._cb + 7) = (char)uVar29;
          pBVar43 = (BaseRAPass *)((long)&(pBVar43->super_FuncPass).super_Pass._vptr_Pass + 1);
        } while (pBVar33 != pBVar43);
      }
      pBVar48 = pBVar47;
      pBVar63 = pBStack_4b8;
      if (cStack_49d == '\0') {
        pBVar52 = (BaseRAPass *)0x0;
        pBStack_4a8 = (BaseRAPass *)((ulong)pBStack_4a8 & 0xffffffff00000000);
        pBVar61 = pBStack_4b8;
        do {
          pBVar58 = (BaseRAPass *)alStack_3e0[(long)pBVar52];
          uVar29 = *(uint *)&(pBVar58->super_FuncPass).super_Pass._cb;
          pBVar62 = (BaseRAPass *)(ulong)uVar29;
          pBVar63 = pBVar61;
          if ((uVar29 & 8) != 0) {
            uVar42 = *(uint *)&(pBVar58->super_FuncPass).super_Pass._vptr_Pass;
            pBVar40 = (BaseRAPass *)(ulong)uVar42;
            pBVar34 = pBVar33;
            pBVar46 = pBVar47;
            if (pBVar40 == (BaseRAPass *)0xffffffff) goto LAB_001236df;
            if ((((RAAssignment *)&pBStack_4c0->field_0x48)->_layout).workCount <= uVar42)
            goto LAB_001236e4;
            bVar28 = *(uint8_t *)
                      ((long)&(pBVar40->super_FuncPass).super_Pass._vptr_Pass +
                      (long)((RAAssignment *)&pBStack_4c0->field_0x48)->_workToPhysMap);
            pBVar34 = (BaseRAPass *)(ulong)bVar28;
            RVar14 = (RegGroup)pBVar61;
            if (bVar28 != 0xff) {
              pBVar47 = (BaseRAPass *)((ulong)pBVar61 & 0xff);
              pcStack_4c8 = (code *)0x123503;
              pBVar25 = pBStack_488;
              RAAssignment::unassign((RAAssignment *)pBStack_488,RVar14,uVar42,(uint)bVar28);
              pBVar43 = extraout_RDX_04;
            }
            pBVar63 = pBStack_4c0;
            bVar28 = *(undefined1 *)((long)&(pBVar58->super_FuncPass).super_Pass._cb + 7);
            pBVar41 = (BaseRAPass *)(ulong)bVar28;
            pBVar33 = pBVar41;
            if (bVar28 != 0xff) {
LAB_00123549:
              pBVar63 = pBVar61;
              if (0x1f < (uint)pBVar33) goto LAB_001236ee;
              bVar28 = (byte)pBVar33;
              pBVar41 = pBVar33;
LAB_0012355d:
              uVar29 = 1 << (bVar28 & 0x1f);
              pBVar62 = (BaseRAPass *)(ulong)uVar29;
              pBVar34 = pBVar33;
              if (((((RAAssignment *)&pBStack_4c0->field_0x48)->_physToWorkMap->assigned)._masks.
                   _data[(long)pBVar63] & uVar29) != 0) goto LAB_001236e9;
              uVar35 = *(uint *)&(pBVar58->super_FuncPass).super_Pass._cb;
              if ((uVar35 >> 0x12 & 1) == 0) {
                pBVar47 = (BaseRAPass *)((ulong)pBVar63 & 0xff);
                pBVar51 = (BaseRAPass *)0x1;
                pcStack_4c8 = (code *)0x123591;
                pBVar33 = pBVar41;
                pBVar25 = pBStack_488;
                RAAssignment::assign
                          ((RAAssignment *)pBStack_488,(RegGroup)pBVar63,uVar42,(uint32_t)pBVar41,
                           true);
                uVar35 = *(uint *)&(pBVar58->super_FuncPass).super_Pass._cb;
                pBVar43 = extraout_RDX_06;
              }
              *(char *)((long)&(pBVar58->super_FuncPass).super_Pass._cb + 7) = (char)pBVar41;
              *(uint *)&(pBVar58->super_FuncPass).super_Pass._cb = uVar35 | 0x200;
              pBStack_4a8 = (BaseRAPass *)CONCAT44(pBStack_4a8._4_4_,(uint)pBStack_4a8 | uVar29);
              pBVar62 = (BaseRAPass *)(ulong)~uVar29;
              pBStack_498 = (BaseRAPass *)CONCAT44(pBStack_498._4_4_,(uint)pBStack_498 & ~uVar29);
              uStack_49c = uStack_49c - 1;
              goto LAB_001235b8;
            }
            uVar29 = ~((int)(short)uVar29 >> 0xf & uStack_4ac | (uint)pBStack_4a8) &
                     *(uint *)((long)&(pBVar58->super_FuncPass).super_Pass._name + 4);
            pBVar34 = (BaseRAPass *)(ulong)uVar29;
            uVar35 = ~(uint)pBStack_498 & uVar29;
            pBVar51 = (BaseRAPass *)(ulong)uVar35;
            pBVar25 = pBStack_4c0;
            if (uVar35 != 0) {
              pBVar47 = (BaseRAPass *)((ulong)pBVar61 & 0xff);
              pcStack_4c8 = (code *)0x123547;
              uVar19 = decideOnAssignment((RALocalAllocator *)pBStack_4c0,RVar14,uVar42,uVar29,
                                          uVar35);
              pBVar33 = (BaseRAPass *)(ulong)uVar19;
              pBVar43 = extraout_RDX_05;
              goto LAB_00123549;
            }
            pBVar33 = (BaseRAPass *)(ulong)(uVar29 & (uint)pBStack_498);
            pBVar45 = (BaseRAPass *)((ulong)pBVar61 & 0xff);
            uStack_4b0 = (uint)pBVar45;
            pBVar51 = (BaseRAPass *)auStack_420;
            pcStack_4c8 = (code *)0x1235ec;
            uVar19 = decideOnSpillFor((RALocalAllocator *)pBStack_4c0,RVar14,(uint32_t)pBVar43,
                                      uVar29 & (uint)pBStack_498,(uint32_t *)pBVar51);
            workId = auStack_420._0_4_;
            if (uVar19 < 0x20) {
              pBVar41 = (BaseRAPass *)(ulong)uVar19;
              bVar28 = (byte)uVar19;
              if ((*(uint *)(*(long *)(&pBVar63->field_0x48 + 0x20) + 0x10 + (long)pBVar61 * 4) >>
                   (uVar19 & 0x1f) & 1) != 0) {
                pcStack_4c8 = (code *)0x12362c;
                EVar15 = onSaveReg((RALocalAllocator *)pBVar63,(RegGroup)uStack_4b0,
                                   auStack_420._0_4_,uVar19);
                if (EVar15 != 0) {
                  return EVar15;
                }
              }
              pBVar47 = (BaseRAPass *)(ulong)uStack_4b0;
              pBVar33 = (BaseRAPass *)(ulong)uVar19;
              pcStack_4c8 = (code *)0x123643;
              pBVar25 = pBStack_488;
              RAAssignment::unassign((RAAssignment *)pBStack_488,(RegGroup)uStack_4b0,workId,uVar19)
              ;
              pBVar43 = extraout_RDX_07;
              pBVar63 = pBStack_4b8;
              goto LAB_0012355d;
            }
            goto LAB_0012371b;
          }
LAB_001235b8:
          pBVar52 = (BaseRAPass *)((long)&(pBVar52->super_FuncPass).super_Pass._vptr_Pass + 1);
          pBVar61 = pBVar63;
        } while (pBStack_470 != pBVar52);
        pBVar48 = pBVar47;
        pBVar58 = pBStack_4c0;
        pBVar61 = pBVar62;
        if (uStack_49c == 0) {
          uStack_47c = uStack_47c | (uint)pBStack_4a8;
          pBStack_4b8 = pBVar63;
          goto LAB_00123674;
        }
      }
      goto LAB_00123725;
    }
LAB_00123674:
    puVar55 = (((RARegMask *)&pBVar58->field_0x28)->_masks)._data + (long)pBStack_4b8;
    *puVar55 = *puVar55 | uStack_47c;
    pBVar63 = (BaseRAPass *)((long)&(pBStack_4b8->super_FuncPass).super_Pass._vptr_Pass + 1);
    pBVar37 = pBVar58;
    if (pBVar63 == (BaseRAPass *)0x4) {
      return 0;
    }
    goto LAB_001224bb;
  }
  uVar29 = uVar29 & 0xff;
  uStack_438 = (ulong)uVar29;
  pBVar48 = (BaseRAPass *)
            ((long)(((RAAssignment *)&pBVar46->field_0x48)->_physToWorkIds)._data +
            ((ulong)(uVar29 << 5) - 0x24));
  pBStack_470 = (BaseRAPass *)(ulong)uVar42;
  pBStack_4a8 = (BaseRAPass *)0x0;
  uStack_49c = 0;
  uVar35 = 0;
  pBVar33 = pBVar34;
  pBVar45 = pBStack_470;
  pBVar47 = pBVar48;
  uVar60 = 0;
  do {
    uVar30 = *(uint *)&(pBVar47->super_FuncPass).super_Pass._cb;
    pBVar51 = (BaseRAPass *)(ulong)uVar30;
    if ((uVar30 & 0x1c00) != 0) {
      uVar38 = uVar30 >> 0xd & 3;
      if ((uVar30 >> 0xc & 1) != 0) {
        uVar38 = 0;
      }
      pBVar33 = (BaseRAPass *)(ulong)uVar38;
      if ((uVar35 >> uVar38 & 1) != 0) {
        return 3;
      }
      uVar35 = uVar35 | 1 << (sbyte)uVar38;
      alStack_3e0[(ulong)uVar38 - 6] = (long)pBVar47;
    }
    pBVar34 = (BaseRAPass *)auStack_420._16_8_;
    if ((uVar30 & 0x40008) != 0) {
      uVar23 = (ulong)uStack_49c;
      uStack_49c = uStack_49c + 1;
      pBVar33 = (BaseRAPass *)(ulong)uStack_49c;
      alStack_3e0[uVar23] = (long)pBVar47;
    }
    uVar23 = uVar60;
    if ((uVar30 >> 0x10 & 1) != 0) {
      uVar23 = (ulong)((int)uVar60 + 1);
      auStack_2e0[uVar60] = pBVar47;
    }
    uStack_4b0 = uVar42;
    pBStack_498 = pBVar48;
    pBStack_448 = pBVar46;
    if ((uVar30 & 4) != 0) {
      if ((uVar30 >> 10 & 1) != 0) goto LAB_001226a6;
      uVar38 = *(uint *)&(pBVar47->super_FuncPass).super_Pass._vptr_Pass;
      pBVar33 = (BaseRAPass *)0xffffffff;
      if ((ulong)uVar38 == 0xffffffff) {
LAB_001236cb:
        pcStack_4c8 = (code *)0x1236d0;
        allocInst();
        pBVar25 = pBVar47;
        pBVar58 = pBVar37;
        pBVar62 = pBVar61;
LAB_001236d0:
        pBVar61 = pBVar63;
        pBVar46 = pBVar45;
        pBVar34 = pBVar33;
        pcStack_4c8 = (code *)0x1236d5;
        allocInst();
LAB_001236d5:
        pcStack_4c8 = (code *)0x1236da;
        allocInst();
LAB_001236da:
        pcStack_4c8 = (code *)0x1236df;
        allocInst();
LAB_001236df:
        pcStack_4c8 = (code *)0x1236e4;
        allocInst();
        pBVar47 = pBVar46;
        pBVar63 = pBVar61;
LAB_001236e4:
        pcStack_4c8 = (code *)0x1236e9;
        allocInst();
LAB_001236e9:
        pBVar33 = pBVar41;
        pcStack_4c8 = (code *)0x1236ee;
        allocInst();
LAB_001236ee:
        pcStack_4c8 = (code *)0x1236f3;
        allocInst();
LAB_001236f3:
        pcStack_4c8 = (code *)0x1236f8;
        allocInst();
        pBVar41 = pBVar33;
        pBVar61 = pBVar62;
LAB_001236f8:
        pcStack_4c8 = (code *)0x1236fd;
        allocInst();
        pBVar33 = pBVar34;
        pBVar48 = pBVar47;
        goto LAB_001236fd;
      }
      pBVar25 = pBVar47;
      pBVar62 = pBVar61;
      if ((((RAAssignment *)&pBVar37->field_0x48)->_layout).workCount <= uVar38) goto LAB_001236d0;
      bVar28 = ((RAAssignment *)&pBVar37->field_0x48)->_workToPhysMap[uVar38].physIds[0];
      bVar2 = *(undefined1 *)((long)&(pBVar47->super_FuncPass).super_Pass._cb + 6);
      pBVar33 = (BaseRAPass *)(ulong)bVar2;
      if (bVar2 == 0xff) {
        if (bVar28 != 0xff) {
          uVar54 = 1 << (bVar28 & 0x1f);
          pBVar53 = (BaseRAPass *)(ulong)uVar54;
          uVar38 = ~uStack_4ac & *(uint *)&(pBVar47->super_FuncPass).super_Pass._name;
          pBVar33 = (BaseRAPass *)(ulong)uVar38;
          if ((uVar38 >> (bVar28 & 0x1f) & 1) != 0) {
            *(byte *)((long)&(pBVar47->super_FuncPass).super_Pass._cb + 6) = bVar28;
            *(uint *)&(pBVar47->super_FuncPass).super_Pass._cb = uVar30 | 0x100;
            if ((uVar30 & 2) != 0) {
              puVar55 = (((RAAssignment *)&pBVar37->field_0x48)->_physToWorkMap->dirty)._masks._data
                        + (long)pBVar63;
              *puVar55 = *puVar55 | uVar54;
            }
            goto LAB_00122687;
          }
LAB_00122699:
          pBStack_4a8 = (BaseRAPass *)(ulong)((uint)pBStack_4a8 | (uint)pBVar53);
        }
        goto LAB_001226a6;
      }
      uVar54 = 1 << (bVar2 & 0x1f);
      pBVar53 = (BaseRAPass *)(ulong)uVar54;
      if ((uStack_4ac >> (bVar2 & 0x1f) & 1) != 0) {
        if (bVar28 != bVar2) {
          pBVar53 = (BaseRAPass *)
                    (ulong)(uVar54 & (((RAAssignment *)&pBVar37->field_0x48)->_physToWorkMap->
                                     assigned)._masks._data[(long)pBVar63]);
          goto LAB_00122699;
        }
        *(uint *)&(pBVar47->super_FuncPass).super_Pass._cb = uVar30 | 0x100;
        pBVar33 = (BaseRAPass *)(ulong)(uVar30 | 0x100);
        if ((uVar30 & 2) != 0) {
          uVar30 = 1 << (bVar28 & 0x1f);
          pBVar51 = (BaseRAPass *)(ulong)uVar30;
          puVar55 = (((RAAssignment *)&pBVar37->field_0x48)->_physToWorkMap->dirty)._masks._data +
                    (long)pBVar63;
          *puVar55 = *puVar55 | uVar30;
          pBVar33 = (BaseRAPass *)(ulong)CONCAT31((int3)(uVar38 >> 8),bVar28);
        }
LAB_00122687:
        pBVar61 = (BaseRAPass *)(ulong)((int)pBVar61 - 1);
        uStack_4ac = uStack_4ac | (uint)pBVar53;
        goto LAB_001226a6;
      }
      goto LAB_0012370c;
    }
    pBVar51 = (BaseRAPass *)(ulong)(uVar30 | 0x100);
    *(uint *)&(pBVar47->super_FuncPass).super_Pass._cb = uVar30 | 0x100;
    pBVar61 = (BaseRAPass *)(ulong)((int)pBVar61 - 1);
LAB_001226a6:
    pBVar47 = (BaseRAPass *)&pBVar47->field_0x20;
    pBVar45 = (BaseRAPass *)(&pBVar45[-1].field_0x3b0 + 0xff);
    uVar60 = uVar23;
  } while (pBVar45 != (BaseRAPass *)0x0);
  uStack_44c = (uint)uVar23;
  pBVar43 = pBStack_4a8;
  if (uVar35 != 0) {
    if ((uVar35 + 1 & uVar35) != 0) {
      return 3;
    }
    uVar30 = 0;
    if (~uVar35 != 0) {
      for (; (~uVar35 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
      }
    }
    pBStack_468 = (BaseRAPass *)(ulong)uVar30;
    if (((ulong)(((FuncPass *)auStack_420._16_8_)->super_Pass)._cb & 0x400) == 0) goto LAB_00122909;
    uVar35 = (((RARegMask *)&pBVar37->_allocator)->_masks)._data[(long)pBVar63];
    if (uVar30 != 0) {
      uVar38 = (((RAAssignment *)&pBVar37->field_0x48)->_layout).workCount;
      pBVar47 = (BaseRAPass *)(ulong)uVar38;
      pBVar25 = (BaseRAPass *)((RAAssignment *)&pBVar37->field_0x48)->_workToPhysMap;
      pBVar51 = (BaseRAPass *)0x0;
      while( true ) {
        pBVar53 = (BaseRAPass *)(ulong)*(uint *)alStack_3e0[(long)&pBVar51[-1].field_0x4aa];
        pBVar33 = pBVar41;
        pBVar62 = pBVar61;
        if (pBVar53 == (BaseRAPass *)0xffffffff) goto LAB_001236f3;
        if (uVar38 <= *(uint *)alStack_3e0[(long)&pBVar51[-1].field_0x4aa]) break;
        *(uint *)(auStack_420 + (long)pBVar51 * 4) =
             (uint)(byte)*(BaseNode *)
                          ((long)&pBVar25[1].super_FuncPass.super_Pass._vptr_Pass +
                          (long)(pBVar53 + -1));
        pBVar51 = (BaseRAPass *)((long)&(pBVar51->super_FuncPass).super_Pass._vptr_Pass + 1);
        if (pBStack_468 == pBVar51) goto LAB_0012273d;
      }
      goto LAB_001236f8;
    }
LAB_0012273d:
    uVar38 = *(uint *)&(pBVar34->super_FuncPass).super_Pass._name;
    if (uVar38 == 0) {
      return 0x3d;
    }
    pBVar25 = (BaseRAPass *)(pBVar37->super_FuncPass).super_Pass._vptr_Pass;
    pBVar51 = (BaseRAPass *)(ulong)(uVar30 * 4);
    pBVar33 = (BaseRAPass *)0xffffffff;
    pBVar53 = (BaseRAPass *)0x0;
    uVar54 = uVar38;
    do {
      uVar31 = 0;
      if (uVar54 != 0) {
        for (; (uVar54 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
        }
      }
      pBStack_490 = pBStack_468;
      if ((uVar38 >> (uVar31 & 0x1f) & 1) != 0) {
        if (uVar30 == 0) {
          pBVar40 = (BaseRAPass *)0xf;
        }
        else {
          pBVar34 = (BaseRAPass *)(ulong)uVar31;
          pBVar40 = (BaseRAPass *)0xf;
          pBVar58 = (BaseRAPass *)0x0;
          do {
            if ((((uVar35 | (uint)pBStack_4a8) & ~uStack_4ac) >> ((uint)pBVar34 & 0x1f) & 1) == 0) {
              pBVar40 = (BaseRAPass *)0x0;
              break;
            }
            if (*(uint *)&pBVar25->field_0x148 <=
                **(uint **)(auStack_420 + (long)pBVar58 * 2 + 0x10)) {
              pcStack_4c8 = (code *)0x123696;
              allocInst();
              goto LAB_00123696;
            }
            bVar65 = pBVar34 ==
                     (BaseRAPass *)
                     (ulong)*(byte *)(*(long *)(*(long *)&pBVar25->_workRegs +
                                               (ulong)**(uint **)(auStack_420 +
                                                                 (long)pBVar58 * 2 + 0x10) * 8) +
                                     0x4a);
            pBVar41 = (BaseRAPass *)(ulong)bVar65;
            pBVar52 = (BaseRAPass *)(ulong)*(uint *)(auStack_420 + (long)pBVar58);
            pBVar40 = (BaseRAPass *)
                      (ulong)((int)pBVar40 + (uint)bVar65 + (uint)(pBVar34 == pBVar52) * 2);
            pBVar58 = (BaseRAPass *)((long)&(pBVar58->super_FuncPass).super_Pass._vptr_Pass + 4);
            pBVar34 = (BaseRAPass *)((long)&(pBVar34->super_FuncPass).super_Pass._vptr_Pass + 1);
            pBVar37 = pBStack_4c0;
          } while (pBVar51 != pBVar58);
        }
        if ((uint)pBVar53 < (uint)pBVar40) {
          pBVar33 = (BaseRAPass *)(ulong)uVar31;
          pBVar53 = pBVar40;
        }
      }
      uVar54 = uVar54 - 1 & uVar54;
    } while (uVar54 != 0);
    if ((int)pBVar33 == -1) {
      return 0x3d;
    }
    pBVar34 = pBVar33;
    pBVar58 = pBVar37;
    if (uVar30 == 0) goto LAB_00122909;
    uVar60 = 0;
    while( true ) {
      uVar38 = 1 << ((byte)pBVar33 & 0x1f);
      pBVar45 = (BaseRAPass *)(ulong)uVar38;
      pBVar25 = *(BaseRAPass **)(auStack_420 + uVar60 + 0x10);
      uVar35 = *(uint *)&(pBVar25->super_FuncPass).super_Pass._vptr_Pass;
      pBVar51 = (BaseRAPass *)(ulong)uVar35;
      pBVar53 = (BaseRAPass *)0xffffffff;
      if (pBVar51 == (BaseRAPass *)0xffffffff) goto LAB_00123711;
      if ((((RAAssignment *)&pBVar37->field_0x48)->_layout).workCount <= uVar35) break;
      pBVar53 = (BaseRAPass *)((RAAssignment *)&pBVar37->field_0x48)->_workToPhysMap;
      WVar3.physIds[0] =
           *(uint8_t (*) [1])
            ((long)&pBVar53[1].super_FuncPass.super_Pass._vptr_Pass + (long)(pBVar51 + -1));
      pBVar51 = (BaseRAPass *)(ulong)(byte)WVar3.physIds[0];
      *(byte *)((long)&(pBVar25->super_FuncPass).super_Pass._cb + 6) = (byte)pBVar33;
      if ((uint)pBVar33 == (uint)(byte)WVar3.physIds[0]) {
        uVar35 = *(uint *)&(pBVar25->super_FuncPass).super_Pass._cb;
        pBVar51 = (BaseRAPass *)(ulong)uVar35;
        pBVar53 = (BaseRAPass *)(ulong)(uVar35 | 0x100);
        *(uint *)&(pBVar25->super_FuncPass).super_Pass._cb = uVar35 | 0x100;
        if ((uVar35 & 2) != 0) {
          puVar55 = (((RAAssignment *)&pBVar37->field_0x48)->_physToWorkMap->dirty)._masks._data +
                    (long)pBVar63;
          *puVar55 = *puVar55 | uVar38;
        }
        pBVar61 = (BaseRAPass *)(ulong)((int)pBVar61 - 1);
      }
      else {
        pBVar43 = (BaseRAPass *)
                  (ulong)((uint)pBVar43 |
                         (((RAAssignment *)&pBVar37->field_0x48)->_physToWorkMap->assigned)._masks.
                         _data[(long)pBVar63] & uVar38);
      }
      uStack_4ac = uStack_4ac | uVar38;
      uVar60 = uVar60 + 8;
      pBVar33 = (BaseRAPass *)(ulong)((uint)pBVar33 + 1);
      pBVar34 = pBVar33;
      if (uVar30 << 3 == uVar60) goto LAB_00122909;
    }
    goto LAB_00123716;
  }
  pBStack_468 = (BaseRAPass *)0x0;
  pBVar34 = pBVar33;
LAB_00122909:
  pBVar64 = pBVar63;
  pBVar45 = pBVar48;
  if ((int)pBVar61 == 0) {
    pBVar61 = (BaseRAPass *)0x0;
LAB_00122c6a:
    pBStack_490 = (BaseRAPass *)CONCAT44(pBStack_490._4_4_,(int)pBVar61);
    if ((uint)pBVar43 != 0) {
      pBVar40 = (BaseRAPass *)
                (ulong)(~(uStack_4ac | (uint)pBVar43 |
                         (((RAAssignment *)&pBVar58->field_0x48)->_physToWorkMap->assigned)._masks.
                         _data[(long)pBVar64] | uStack_47c) &
                       (((RARegMask *)&pBVar58->_allocator)->_masks)._data[(long)pBVar64]);
      do {
        uVar29 = 0;
        if ((uint)pBVar43 != 0) {
          for (; ((uint)pBVar43 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        pBVar41 = (BaseRAPass *)(ulong)uVar29;
        pPVar20 = ((RAAssignment *)&pBVar58->field_0x48)->_physToWorkMap;
        pBVar34 = pBVar41;
        if (((pPVar20->assigned)._masks._data[(long)pBVar64] >> (uVar29 & 0x1f) & 1) != 0) {
          puVar55 = (((RAAssignment *)&pBVar58->field_0x48)->_physToWorkIds)._data[(long)pBVar64];
          uVar42 = puVar55[(long)pBVar41];
          uVar35 = (uint)pBVar40;
          pBVar52 = pBVar64;
          pBStack_4a8 = pBVar43;
          if (uVar35 != 0) {
            pBVar52 = (BaseRAPass *)((ulong)pBVar64 & 0xff);
            pcStack_4c8 = (code *)0x122ce8;
            pBVar51 = pBVar40;
            pBVar53 = pBStack_430;
            uVar19 = decideOnReassignment
                               ((RALocalAllocator *)pBVar58,(RegGroup)pBVar64,uVar42,
                                (uint32_t)puVar55,uVar35,(RAInst *)pBStack_430);
            if (uVar19 != 0xff) {
              if (uVar19 != uVar29) {
                pBVar51 = (BaseRAPass *)(ulong)uVar29;
                pcStack_4c8 = (code *)0x122d4d;
                RAAssignment::reassign
                          ((RAAssignment *)pBStack_488,(RegGroup)pBVar64,uVar42,uVar19,uVar29);
                pBVar37 = (BaseRAPass *)(pBStack_4c0->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_4c8 = (code *)0x122d62;
                iVar16 = (*(pBVar37->super_FuncPass).super_Pass._vptr_Pass[9])
                                   (pBVar37,(ulong)uVar42,(ulong)uVar19,(ulong)uVar29);
                if (iVar16 != 0) {
                  return iVar16;
                }
              }
              pBVar34 = (BaseRAPass *)(ulong)uVar19;
              pBVar40 = (BaseRAPass *)(ulong)(uVar35 ^ 1 << (uVar19 & 0x1f));
              puVar55 = (((RARegMask *)&pBStack_4c0->field_0x28)->_masks)._data + (long)pBStack_4b8;
              *puVar55 = *puVar55 | 1 << ((byte)uVar19 & 0x1f);
              pBVar45 = pBStack_498;
              pBVar43 = pBStack_4a8;
              pBVar58 = pBStack_4c0;
              pBVar64 = pBStack_4b8;
              goto LAB_00122d90;
            }
            pPVar20 = ((RAAssignment *)&pBVar58->field_0x48)->_physToWorkMap;
            pBVar52 = pBStack_4b8;
          }
          if (((pPVar20->dirty)._masks._data[(long)pBVar52] & 1 << ((byte)uVar29 & 0x1f)) != 0) {
            pcStack_4c8 = (code *)0x122d10;
            EVar15 = onSaveReg((RALocalAllocator *)pBVar58,(RegGroup)pBVar52,uVar42,uVar29);
            if (EVar15 != 0) {
              return EVar15;
            }
          }
          pBVar34 = (BaseRAPass *)(ulong)uVar29;
          pcStack_4c8 = (code *)0x122d2b;
          RAAssignment::unassign((RAAssignment *)pBStack_488,(RegGroup)pBVar52,uVar42,uVar29);
          pBVar45 = pBStack_498;
          pBVar43 = pBStack_4a8;
          pBVar64 = pBVar52;
        }
LAB_00122d90:
        uVar29 = (uint)pBVar43 - 1 & (uint)pBVar43;
        pBVar43 = (BaseRAPass *)(ulong)uVar29;
      } while (uVar29 != 0);
    }
    pBVar25 = (BaseRAPass *)((ulong)pBStack_490 & 0xffffffff);
    pBVar43 = (BaseRAPass *)(ulong)uStack_4b0;
    pBVar46 = pBVar45;
    if ((uint)pBStack_490 != 0) {
      pBStack_458 = (BaseRAPass *)(ulong)(uint)((int)pBStack_470 << 5);
      pBVar34 = (BaseRAPass *)(ulong)(uint)((int)uStack_438 << 5);
      pBStack_448 = (BaseRAPass *)
                    ((long)&(pBStack_448->super_FuncPass).super_Pass._vptr_Pass +
                    (long)&pBVar34->field_0x5a);
      pBStack_478 = (BaseRAPass *)((ulong)pBStack_478 & 0xffffffff00000000);
      pBVar33 = pBVar58;
      do {
        pBVar47 = pBVar25;
        pBVar58 = pBVar33;
        if ((int)pBVar43 != 0) {
          pBVar52 = (BaseRAPass *)0x0;
          pBStack_490 = (BaseRAPass *)CONCAT44(pBStack_490._4_4_,(int)pBVar25);
          pBVar63 = pBVar64;
LAB_00122df5:
          pBVar64 = pBStack_4b8;
          pBVar58 = pBStack_4c0;
          if ((*(uint8_t *)((long)&pBVar45->super_FuncPass + (long)pBVar52 * 0x20 + 9) & 1) != 0)
          goto LAB_001230c8;
          pBVar61 = (BaseRAPass *)((long)&pBVar45->super_FuncPass + (long)pBVar52 * 0x20);
          uVar29 = *(uint *)&(pBVar61->super_FuncPass).super_Pass._vptr_Pass;
          pBVar40 = (BaseRAPass *)(ulong)uVar29;
          if (pBVar40 != (BaseRAPass *)0xffffffff) {
            pBVar53 = pBVar25;
            if ((((RAAssignment *)&pBVar33->field_0x48)->_layout).workCount <= uVar29)
            goto LAB_001236b7;
            BVar4 = *(BaseNode *)
                     ((long)&(pBVar40->super_FuncPass).super_Pass._vptr_Pass +
                     (long)((RAAssignment *)&pBVar33->field_0x48)->_workToPhysMap);
            pBVar41 = (BaseRAPass *)(ulong)(byte)BVar4;
            BVar5 = *(BaseNode *)((long)&(pBVar61->super_FuncPass).super_Pass._cb + 6);
            pBVar33 = (BaseRAPass *)(ulong)(byte)BVar5;
            if (BVar5 == BVar4) goto LAB_001236bc;
            pBVar37 = pBVar33;
            if (0x1f < (byte)BVar5) goto LAB_001236c1;
            uVar42 = *(uint *)(*(long *)(&pBStack_4c0->field_0x48 + (long)pBVar63 * 8 + 0x28) +
                              (long)pBVar33 * 4);
            pBVar63 = (BaseRAPass *)(ulong)uVar42;
            uVar30 = (uint)(byte)BVar5;
            uVar35 = (uint)(byte)BVar4;
            pBStack_4a8 = pBVar25;
            if (pBVar63 == (BaseRAPass *)0xffffffff) {
LAB_00122fc6:
              pBVar63 = pBStack_4b8;
              if (BVar4 == (BaseNode)0xff) {
                pBVar51 = (BaseRAPass *)0x0;
                pcStack_4c8 = (code *)0x12301a;
                RAAssignment::assign
                          ((RAAssignment *)pBStack_488,(RegGroup)pBStack_4b8,uVar29,uVar30,false);
                pBVar37 = (BaseRAPass *)(pBStack_4c0->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_4c8 = (code *)0x12302c;
                iVar16 = (*(pBVar37->super_FuncPass).super_Pass._vptr_Pass[0xb])
                                   (pBVar37,pBVar40,(ulong)uVar30);
              }
              else {
                pBVar51 = (BaseRAPass *)(ulong)uVar35;
                pcStack_4c8 = (code *)0x122fe9;
                RAAssignment::reassign
                          ((RAAssignment *)pBStack_488,(RegGroup)pBStack_4b8,uVar29,uVar30,uVar35);
                pBVar37 = (BaseRAPass *)(pBStack_4c0->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_4c8 = (code *)0x122ffd;
                iVar16 = (*(pBVar37->super_FuncPass).super_Pass._vptr_Pass[9])
                                   (pBVar37,pBVar40,(ulong)uVar30,(ulong)uVar35);
              }
              if (iVar16 != 0) {
                return iVar16;
              }
              uVar29 = *(uint *)&(pBVar61->super_FuncPass).super_Pass._cb;
              uVar42 = uVar29 | 0x100;
              pBVar34 = (BaseRAPass *)(ulong)uVar42;
              *(uint *)&(pBVar61->super_FuncPass).super_Pass._cb = uVar42;
              if ((uVar29 & 2) != 0) {
                pBVar34 = (BaseRAPass *)((RAAssignment *)&pBStack_4c0->field_0x48)->_physToWorkMap;
                puVar55 = (uint *)((long)(&pBVar34->_formatOptions + -10) + (long)pBVar63 * 4);
                *puVar55 = *puVar55 | 1 << ((byte)BVar5 & 0x1f);
              }
              pBVar25 = (BaseRAPass *)(ulong)((int)pBStack_4a8 - 1);
              pBVar45 = pBStack_498;
LAB_00123085:
              pBVar43 = (BaseRAPass *)(ulong)uStack_4b0;
              pBVar47 = (BaseRAPass *)((ulong)pBStack_490 & 0xffffffff);
              pBVar33 = pBStack_4c0;
              goto LAB_001230c8;
            }
            pp_Var56 = (pBStack_4c0->super_FuncPass).super_Pass._vptr_Pass;
            if (*(uint *)(pp_Var56 + 0x29) <= uVar42) goto LAB_001236c6;
            pBVar34 = pBVar33;
            if ((uVar35 != 0xff) &&
               (pcVar8 = (pBStack_4c0->super_FuncPass).super_Pass._name,
               bVar28 = *(byte *)((long)(&pBStack_4b8->_formatOptions + -10) + (long)pcVar8),
               pBVar34 = (BaseRAPass *)
                         (CONCAT71((int7)((ulong)pcVar8 >> 8),bVar28) & 0xffffffffffffff01),
               (bVar28 & 1) != 0)) {
              pp_Stack_460 = *(_func_int ***)(pp_Var56[0x28] + (long)pBVar63 * 8);
              pcStack_4c8 = (code *)0x122ec8;
              RAAssignment::swap((RAAssignment *)pBStack_488,(RegGroup)pBStack_4b8,uVar29,uVar35,
                                 uVar42,(uint)(byte)BVar5);
              pBVar37 = (BaseRAPass *)(pBStack_4c0->super_FuncPass).super_Pass._vptr_Pass;
              pcStack_4c8 = (code *)0x122edf;
              iVar16 = (*(pBVar37->super_FuncPass).super_Pass._vptr_Pass[10])
                                 (pBVar37,pBVar40,(ulong)uVar35,pBVar63,(ulong)(uint)(byte)BVar5);
              if (iVar16 != 0) {
                return iVar16;
              }
              uVar29 = *(uint *)&(pBVar61->super_FuncPass).super_Pass._cb;
              *(uint *)&(pBVar61->super_FuncPass).super_Pass._cb = uVar29 | 0x100;
              if ((uVar29 & 2) != 0) {
                puVar55 = (((RAAssignment *)&pBStack_4c0->field_0x48)->_physToWorkMap->dirty)._masks
                          ._data + (long)pBStack_4b8;
                *puVar55 = *puVar55 | 1 << ((byte)BVar5 & 0x1f);
              }
              pBVar25 = (BaseRAPass *)(ulong)((int)pBStack_4a8 - 1);
              pBVar34 = (BaseRAPass *)0x0;
              pBVar47 = (BaseRAPass *)((ulong)pBStack_490 & 0xffffffff);
              do {
                pBVar33 = pBStack_4c0;
                pBVar45 = pBStack_498;
                pBVar51 = pBStack_458;
                if (*(int *)(&pBStack_448[-1].field_0x3b0 + 0xf2 + (long)pBVar34) ==
                    *(int *)pp_Stack_460) {
                  pBVar43 = (BaseRAPass *)(ulong)uStack_4b0;
                  pBVar63 = pBStack_4b8;
                  if (*(BaseNode *)
                       ((long)&pBStack_448[1].super_FuncPass.super_Pass._vptr_Pass +
                       (long)(pBVar34 + -1)) != BVar4) goto LAB_001230c8;
                  uVar29 = *(uint *)(&pBStack_448[-1].field_0x3b0 + 0xfa + (long)pBVar34);
                  *(uint *)(&pBStack_448[-1].field_0x3b0 + 0xfa + (long)pBVar34) = uVar29 | 0x100;
                  if ((uVar29 & 2) != 0) {
                    pBVar34 = (BaseRAPass *)
                              ((RAAssignment *)&pBStack_4c0->field_0x48)->_physToWorkMap;
                    puVar55 = (uint *)((long)(&pBVar34->_formatOptions + -10) +
                                      (long)pBStack_4b8 * 4);
                    *puVar55 = *puVar55 | 1 << ((byte)BVar4 & 0x1f);
                  }
                  pBVar25 = (BaseRAPass *)(ulong)((int)pBStack_4a8 - 2);
                  break;
                }
                pBVar34 = (BaseRAPass *)&pBVar34->field_0x20;
              } while (pBStack_458 != pBVar34);
              pBVar43 = (BaseRAPass *)(ulong)uStack_4b0;
              pBVar63 = pBStack_4b8;
              goto LAB_001230c8;
            }
            pBVar63 = pBStack_4b8;
            if (((ulong)pBStack_478 & 1) == 0) goto LAB_00123085;
            uVar38 = ~*(uint *)(*(long *)(&pBStack_4c0->field_0x48 + 0x20) + (long)pBStack_4b8 * 4)
                     & *(uint *)(&pBStack_4c0->_allocator + (long)pBStack_4b8 * 4);
            if (uVar38 == 0) {
              if ((*(uint *)(*(long *)(&pBStack_4c0->field_0x48 + 0x20) + 0x10 +
                            (long)pBStack_4b8 * 4) >> (uVar30 & 0x1f) & 1) != 0) {
                pcStack_4c8 = (code *)0x122fa5;
                EVar15 = onSaveReg((RALocalAllocator *)pBStack_4c0,(RegGroup)pBStack_4b8,uVar42,
                                   uVar30);
                if (EVar15 != 0) {
                  return EVar15;
                }
              }
              pcStack_4c8 = (code *)0x122fc6;
              RAAssignment::unassign
                        ((RAAssignment *)pBStack_488,(RegGroup)pBStack_4b8,uVar42,uVar30);
              goto LAB_00122fc6;
            }
            uVar42 = ~*(uint *)(&pBStack_4c0->field_0x38 + (long)pBStack_4b8 * 4) & uVar38;
            if (uVar42 == 0) {
              uVar42 = uVar38;
            }
            uVar30 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
              }
            }
            if (uVar30 != uVar35) {
              pBVar51 = (BaseRAPass *)(ulong)uVar35;
              pcStack_4c8 = (code *)0x123123;
              RAAssignment::reassign
                        ((RAAssignment *)pBStack_488,(RegGroup)pBStack_4b8,uVar29,uVar30,uVar35);
              pp_Var56 = (pBVar58->super_FuncPass).super_Pass._vptr_Pass;
              pcStack_4c8 = (code *)0x123134;
              iVar16 = (**(code **)(*pp_Var56 + 0x48))(pp_Var56,pBVar40,uVar30,BVar4);
              pBVar45 = pBStack_498;
              pBVar52 = pBVar64;
              if (iVar16 != 0) {
                return iVar16;
              }
            }
            pBVar34 = (BaseRAPass *)(ulong)uVar30;
            *(uint *)(&pBVar58->field_0x28 + (long)pBVar64 * 4) =
                 *(uint *)(&pBVar58->field_0x28 + (long)pBVar64 * 4) | 1 << ((byte)uVar30 & 0x1f);
            pBVar43 = (BaseRAPass *)(ulong)uStack_4b0;
            pBVar47 = (BaseRAPass *)((ulong)pBStack_490 & 0xffffffff);
            goto LAB_001230d9;
          }
          pcStack_4c8 = (code *)0x1236b7;
          allocInst();
          pBVar53 = pBVar25;
LAB_001236b7:
          pcStack_4c8 = (code *)0x1236bc;
          allocInst();
LAB_001236bc:
          pcStack_4c8 = (code *)0x1236c1;
          allocInst();
          pBVar37 = pBVar33;
LAB_001236c1:
          pBVar33 = pBVar34;
          pcStack_4c8 = (code *)0x1236c6;
          allocInst();
LAB_001236c6:
          pcStack_4c8 = (code *)0x1236cb;
          allocInst();
          goto LAB_001236cb;
        }
LAB_001230d9:
        pBVar34 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar34 >> 8),(int)pBVar47 == (int)pBVar25);
        pBStack_478 = (BaseRAPass *)CONCAT44(pBStack_478._4_4_,(int)pBVar34);
        pBVar46 = pBVar45;
        pBVar33 = pBVar58;
      } while ((int)pBVar25 != 0);
    }
    cVar66 = uStack_49c == 0;
    pBVar41 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar41 >> 8),cVar66);
    if ((bool)cVar66) {
      pBStack_470 = (BaseRAPass *)0x0;
      uStack_49c = 0;
      pBVar62 = (BaseRAPass *)(ulong)uStack_47c;
      pBVar63 = pBVar64;
      cVar66 = cStack_49d;
    }
    else {
      pBStack_470 = (BaseRAPass *)(ulong)uStack_49c;
      pBVar61 = (BaseRAPass *)0x0;
      pBVar62 = (BaseRAPass *)(ulong)uStack_47c;
      do {
        pBVar52 = (BaseRAPass *)alStack_3e0[(long)pBVar61];
        uVar29 = *(uint *)&(pBVar52->super_FuncPass).super_Pass._vptr_Pass;
        pBVar43 = (BaseRAPass *)(ulong)uVar29;
        if (pBVar43 == (BaseRAPass *)0xffffffff) goto LAB_001236d5;
        if ((((RAAssignment *)&pBVar58->field_0x48)->_layout).workCount <= uVar29)
        goto LAB_001236da;
        bVar28 = ((WorkToPhysMap *)
                 ((long)&(pBVar43->super_FuncPass).super_Pass._vptr_Pass +
                 (long)((RAAssignment *)&pBVar58->field_0x48)->_workToPhysMap))->physIds[0];
        pBVar40 = (BaseRAPass *)(ulong)bVar28;
        uVar42 = (uint)bVar28;
        if (uVar42 != 0xff) {
          pBVar46 = (BaseRAPass *)((ulong)pBStack_4b8 & 0xff);
          pBVar34 = (BaseRAPass *)(ulong)uVar42;
          pcStack_4c8 = (code *)0x1231cb;
          pBVar25 = pBStack_488;
          RAAssignment::unassign((RAAssignment *)pBStack_488,(RegGroup)pBStack_4b8,uVar29,uVar42);
          pBVar62 = (BaseRAPass *)(ulong)((uint)pBVar62 & ~(1 << (bVar28 & 0x1f)));
          pBVar43 = extraout_RDX_00;
        }
        uStack_49c = (uStack_49c - 1) +
                     (uint)((*(uint *)&(pBVar52->super_FuncPass).super_Pass._cb >> 3 & 1) != 0);
        pBVar61 = (BaseRAPass *)((long)&(pBVar61->super_FuncPass).super_Pass._vptr_Pass + 1);
        pBVar63 = pBStack_4b8;
      } while (pBStack_470 != pBVar61);
    }
    goto LAB_00123209;
  }
  if (uVar42 == 0) goto LAB_00122c6a;
  pBVar25 = (BaseRAPass *)
            (ulong)(~(uint)pBVar43 &
                   (((RAAssignment *)&pBVar58->field_0x48)->_physToWorkMap->assigned)._masks._data
                   [(long)pBVar63]);
  uVar29 = uVar29 << 5;
  pBVar52 = (BaseRAPass *)
            ((long)(((RAAssignment *)&pBVar46->field_0x48)->_physToWorkIds)._data +
            ((ulong)uVar29 - 0xc));
  pBVar51 = (BaseRAPass *)(ulong)(uVar42 << 5);
  pBVar41 = (BaseRAPass *)0x0;
  pBVar34 = pBVar46;
  pBStack_478 = pBVar51;
  while (uVar42 = *(uint *)((long)(((RAAssignment *)&pBVar46->field_0x48)->_physToWorkIds)._data +
                            ((ulong)uVar29 - 0x1c) + (long)pBVar41), (uVar42 >> 8 & 1) != 0) {
LAB_00122bd1:
    pBVar41 = (BaseRAPass *)&pBVar41->field_0x20;
    pBVar45 = pBVar48;
    pBVar64 = pBVar63;
    if (pBVar51 == pBVar41) goto LAB_00122c6a;
  }
  uVar35 = *(uint *)((long)(((RAAssignment *)&pBVar46->field_0x48)->_physToWorkIds)._data +
                     ((ulong)uVar29 - 0x24) + (long)pBVar41);
  pBVar40 = (BaseRAPass *)(ulong)uVar35;
  pBVar33 = (BaseRAPass *)0xffffffff;
  if (pBVar40 == (BaseRAPass *)0xffffffff) goto LAB_00123702;
  if ((((RAAssignment *)&pBVar58->field_0x48)->_layout).workCount <= uVar35) goto LAB_00123707;
  pBVar33 = (BaseRAPass *)((RAAssignment *)&pBVar58->field_0x48)->_workToPhysMap;
  BVar4 = *(BaseNode *)
           ((long)&pBVar33[1].super_FuncPass.super_Pass._vptr_Pass + (long)(pBVar40 + -1));
  pBVar58 = (BaseRAPass *)(ulong)(byte)BVar4;
  iVar16 = (int)pBVar61;
  if ((((uStack_428 & 1) != 0) || ((uVar42 & 0x10) == 0)) || (BVar4 != (BaseNode)0xff)) {
LAB_00122995:
    pBVar34 = pBVar33;
    pBVar58 = pBStack_4c0;
    pBVar63 = pBStack_4b8;
    if ((uint8_t)*(uint8_t (*) [1])
                  ((long)(((RAAssignment *)&pBVar46->field_0x48)->_physToWorkIds)._data +
                   ((ulong)uVar29 - 0x16) + (long)pBVar41) == 0xff) {
      pBStack_490 = (BaseRAPass *)CONCAT44(pBStack_490._4_4_,(int)pBVar25);
      pp_Stack_460 = (_func_int **)CONCAT44(pp_Stack_460._4_4_,(uint)(RegGroup)pBStack_4b8);
      pcStack_4c8 = (code *)0x122aeb;
      uVar19 = decideOnAssignment((RALocalAllocator *)pBStack_4c0,(RegGroup)pBStack_4b8,uVar35,
                                  (uint32_t)pBVar33,
                                  ~(uStack_4ac | (uint)pBVar43) &
                                  *(uint *)((long)(((RAAssignment *)&pBVar46->field_0x48)->
                                                  _physToWorkIds)._data + ((ulong)uVar29 - 0x14) +
                                           (long)pBVar41));
      pBVar34 = (BaseRAPass *)(ulong)uVar19;
      uVar42 = 1 << ((uint8_t)(uint8_t)uVar19 & 0x1f);
      pBVar53 = (BaseRAPass *)(ulong)uVar42;
      uVar30 = (uint)pBVar43 | uVar42 & (uint)pBStack_490;
      pBVar43 = (BaseRAPass *)(ulong)uVar30;
      *(uint8_t *)
       ((long)(((RAAssignment *)&pBVar46->field_0x48)->_physToWorkIds)._data +
        ((ulong)uVar29 - 0x16) + (long)pBVar41) = (uint8_t)(uint8_t)uVar19;
      uVar38 = (uint)(byte)BVar4;
      pBVar58 = pBStack_4c0;
      if (uVar38 == 0xff) {
        uVar30 = (uint)pBStack_490;
        if ((uVar42 & (uint)pBStack_490) == 0) {
          pBStack_458 = (BaseRAPass *)CONCAT44(pBStack_458._4_4_,uVar42);
          pcStack_4c8 = (code *)0x122c03;
          pBStack_4a8 = pBVar43;
          RAAssignment::assign
                    ((RAAssignment *)pBStack_488,(RegGroup)pp_Stack_460,uVar35,uVar19,false);
          pBVar58 = pBStack_4c0;
          pBVar37 = (BaseRAPass *)(pBStack_4c0->super_FuncPass).super_Pass._vptr_Pass;
          pcStack_4c8 = (code *)0x122c19;
          iVar18 = (*(pBVar37->super_FuncPass).super_Pass._vptr_Pass[0xb])(pBVar37,pBVar40,pBVar34);
          if (iVar18 != 0) {
            return iVar18;
          }
          uVar42 = *(uint *)((long)(((RAAssignment *)&pBVar46->field_0x48)->_physToWorkIds)._data +
                             ((ulong)uVar29 - 0x1c) + (long)pBVar41);
          *(uint *)((long)(((RAAssignment *)&pBVar46->field_0x48)->_physToWorkIds)._data +
                    ((ulong)uVar29 - 0x1c) + (long)pBVar41) = uVar42 | 0x100;
          pBVar53 = (BaseRAPass *)((ulong)pBStack_458 & 0xffffffff);
          if ((uVar42 & 2) != 0) {
            puVar55 = (((RAAssignment *)&pBVar58->field_0x48)->_physToWorkMap->dirty)._masks._data +
                      (long)pBStack_4b8;
            *puVar55 = *puVar55 | (uint)pBStack_458;
          }
          pBVar61 = (BaseRAPass *)(ulong)(iVar16 - 1);
          pBVar40 = pBVar34;
          pBVar43 = pBStack_4a8;
          uVar30 = (uint)pBStack_490;
        }
      }
      else {
        pBVar43 = (BaseRAPass *)(ulong)(uVar30 | 1 << (uVar38 & 0x1f));
        uVar30 = (uint)pBStack_490 & ~(1 << (uVar38 & 0x1f));
        if ((uVar42 & uVar30) == 0) {
          if (uVar19 != uVar38) {
            pBStack_490 = (BaseRAPass *)CONCAT44(pBStack_490._4_4_,uVar30);
            pBStack_458 = (BaseRAPass *)CONCAT44(pBStack_458._4_4_,uVar42);
            pcStack_4c8 = (code *)0x122b51;
            pBStack_4a8 = pBVar43;
            RAAssignment::reassign
                      ((RAAssignment *)pBStack_488,(RegGroup)pp_Stack_460,uVar35,uVar19,
                       (uint)(byte)BVar4);
            pBVar37 = (BaseRAPass *)(pBStack_4c0->super_FuncPass).super_Pass._vptr_Pass;
            pcStack_4c8 = (code *)0x122b66;
            iVar18 = (*(pBVar37->super_FuncPass).super_Pass._vptr_Pass[9])
                               (pBVar37,pBVar40,pBVar34,(ulong)(byte)BVar4);
            pBVar53 = (BaseRAPass *)((ulong)pBStack_458 & 0xffffffff);
            pBVar43 = pBStack_4a8;
            uVar30 = (uint)pBStack_490;
            if (iVar18 != 0) {
              return iVar18;
            }
          }
          uVar42 = *(uint *)((long)(((RAAssignment *)&pBVar46->field_0x48)->_physToWorkIds)._data +
                             ((ulong)uVar29 - 0x1c) + (long)pBVar41);
          *(uint *)((long)(((RAAssignment *)&pBVar46->field_0x48)->_physToWorkIds)._data +
                    ((ulong)uVar29 - 0x1c) + (long)pBVar41) = uVar42 | 0x100;
          if ((uVar42 & 2) != 0) {
            puVar55 = (((RAAssignment *)&pBStack_4c0->field_0x48)->_physToWorkMap->dirty)._masks.
                      _data + (long)pBStack_4b8;
            *puVar55 = *puVar55 | (uint)pBVar53;
          }
          pBVar61 = (BaseRAPass *)(ulong)(iVar16 - 1);
          pBVar58 = pBStack_4c0;
        }
      }
      uStack_4ac = uStack_4ac | 1 << (uVar19 & 0x1f);
      pBVar25 = (BaseRAPass *)(ulong)(uVar30 | (uint)pBVar53);
      pBVar48 = pBStack_498;
      pBVar51 = pBStack_478;
      pBVar63 = pBStack_4b8;
    }
    goto LAB_00122bd1;
  }
  uVar42 = *(uint *)((long)&pBVar52->_archTraits + (long)&pBVar41[-1].field_0x3b0);
  pBVar63 = (BaseRAPass *)(ulong)uVar42;
  uVar30 = uVar42 ^ uVar42 - 1;
  pBVar33 = (BaseRAPass *)(ulong)uVar30;
  if (uVar30 <= uVar42 - 1) goto LAB_00122995;
  pp_Var56 = (pBStack_4c0->super_FuncPass).super_Pass._vptr_Pass;
  if (uVar35 < *(uint *)(pp_Var56 + 0x29)) {
    pBVar33 = *(BaseRAPass **)(pp_Var56[0x28] + (long)pBVar40 * 8);
    WVar3.physIds[0] =
         *(uint8_t (*) [1])
          ((long)(((RAAssignment *)&pBVar46->field_0x48)->_physToWorkIds)._data +
           ((ulong)uVar29 - 0x17) + (long)pBVar41);
    pBVar53 = (BaseRAPass *)(ulong)(byte)WVar3.physIds[0];
    pBVar49 = (BaseCompiler *)(pBVar33->super_FuncPass).super_Pass._cb;
    uVar30._0_1_ = (pBVar49->super_BaseBuilder).super_BaseEmitter._emitterType;
    uVar30._1_1_ = (pBVar49->super_BaseBuilder).super_BaseEmitter._emitterFlags;
    uVar30._2_1_ = (pBVar49->super_BaseBuilder).super_BaseEmitter._instructionAlignment;
    uVar30._3_1_ = (pBVar49->super_BaseBuilder).super_BaseEmitter._reservedBaseEmitter;
    if ((byte)WVar3.physIds[0] <= uVar30) {
      if (*(long *)(((RARegMask *)&pBVar33->_allocator)->_masks)._data == 0) {
        pBStack_490 = (BaseRAPass *)CONCAT44(pBStack_490._4_4_,(int)pBVar25);
        pcStack_4c8 = (code *)0x122a33;
        pBStack_4a8 = pBVar43;
        pp_Stack_460 = pp_Var56;
        pRVar24 = RAStackAllocator::newSlot
                            ((RAStackAllocator *)(pp_Var56 + 0x3f),
                             *(uint32_t *)((long)pp_Var56 + 0x1dc),uVar30,
                             (uint)(byte)(char)(pBVar49->super_BaseBuilder).super_BaseEmitter.
                                               _validationFlags,1);
        pBVar25 = (BaseRAPass *)((ulong)pBStack_490 & 0xffffffff);
        *(RAStackSlot **)(((RARegMask *)&pBVar33->_allocator)->_masks)._data = pRVar24;
        pBVar33->field_0x25 = pBVar33->field_0x25 | 1;
        pBVar48 = pBStack_498;
        pBVar51 = pBStack_478;
        pBVar43 = pBStack_4a8;
        pp_Var56 = pp_Stack_460;
      }
      uVar35 = 0;
      if (uVar42 != 0) {
        for (; (uVar42 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
        }
      }
      pIVar44 = (InstNode *)(auStack_420._56_8_ + (ulong)(uVar35 & 0xfffffffc) * 4);
      uVar42 = *(uint *)(pp_Var56 + 0x3b);
      *(uint32_t *)(pIVar44 + 4) =
           *(uint32_t *)((long)&(pBVar33->super_FuncPass).super_Pass._vptr_Pass + 4);
      *(undefined8 *)(pIVar44 + 8) = 0;
      pBVar53 = (BaseRAPass *)((ulong)(byte)WVar3.physIds[0] << 0x18);
      uVar42 = (uVar42 & 0xf8) + (int)pBVar53 + 0x2002;
      pBVar34 = (BaseRAPass *)(ulong)uVar42;
      *(uint *)pIVar44 = uVar42;
      *(undefined4 *)((long)&pBVar52->_archTraits + (long)&pBVar41[-1].field_0x3b0) = 0;
      pBVar10 = (BaseNode *)
                ((long)(((RAAssignment *)&pBVar46->field_0x48)->_physToWorkIds)._data +
                 ((ulong)uVar29 - 0x1b) + (long)pBVar41);
      *pBVar10 = (BaseNode)((uint8_t)*(uint8_t (*) [1])pBVar10 | 1);
      puVar12 = (undefined1 *)((long)&(pBStack_430->super_FuncPass).super_Pass._cb + 7);
      *puVar12 = *puVar12 | 0x40;
      pBVar61 = (BaseRAPass *)(ulong)(iVar16 - 1);
      uStack_428 = CONCAT71((int7)((ulong)pBStack_430 >> 8),1);
      pBVar40 = pBVar33;
      pBVar58 = pBStack_4c0;
      pBVar63 = pBStack_4b8;
      goto LAB_00122bd1;
    }
    goto LAB_00122995;
  }
LAB_00123720:
  pcStack_4c8 = (code *)0x123725;
  allocInst();
LAB_00123725:
  pcStack_4c8 = decideOnAssignment;
  allocInst();
  uVar29 = (uint)pBVar51;
  if (uVar29 == 0) {
    pBStack_4d0 = (BaseRAPass *)0x123782;
    decideOnAssignment();
LAB_00123782:
    pBStack_4d0 = (BaseRAPass *)0x123787;
    decideOnAssignment();
  }
  else {
    pBVar37 = (BaseRAPass *)(pBVar25->super_FuncPass).super_Pass._vptr_Pass;
    if (*(uint *)&pBVar37->field_0x148 <= extraout_EDX) goto LAB_00123782;
    pBVar33 = *(BaseRAPass **)(*(long *)&pBVar37->_workRegs + (ulong)extraout_EDX * 8);
    bVar28 = (((RAAssignment *)&pBVar33->field_0x48)->_layout).physIndex.super_RARegCount.field_0.
             _regs[2];
    if ((bVar28 != 0xff) && ((uVar29 >> (bVar28 & 0x1f) & 1) != 0)) {
      return (uint)bVar28;
    }
    if ((byte)pBVar48 < 4) {
      uVar42 = (((RARegMask *)&pBVar33->field_0x38)->_masks)._data[1] & uVar29;
      if (uVar42 == 0) {
        uVar42 = uVar29;
      }
      uVar29 = ~(((RARegMask *)&pBVar25->field_0x38)->_masks)._data[(ulong)pBVar48 & 0xff] & uVar42;
      if (uVar29 == 0) {
        uVar29 = uVar42;
      }
      iVar16 = 0;
      if (uVar29 != 0) {
        for (; (uVar29 >> iVar16 & 1) == 0; iVar16 = iVar16 + 1) {
        }
        return iVar16;
      }
      return 0;
    }
  }
  uVar29 = (uint)pBVar33;
  pBStack_4d0 = (BaseRAPass *)decideOnReassignment;
  decideOnAssignment();
  uVar42 = (uint)pBVar51;
  pBStack_4d0 = pBVar40;
  if (uVar42 == 0) {
    pBStack_4d8 = (BaseRAPass *)0x12385b;
    decideOnReassignment();
LAB_0012385b:
    pBStack_4d8 = (BaseRAPass *)0x123860;
    decideOnReassignment();
  }
  else {
    pBVar37 = (BaseRAPass *)(pBVar25->super_FuncPass).super_Pass._vptr_Pass;
    if (*(uint *)&pBVar37->field_0x148 <= extraout_EDX_00) goto LAB_0012385b;
    lVar32 = *(long *)(*(long *)&pBVar37->_workRegs + (ulong)extraout_EDX_00 * 8);
    bVar28 = *(byte *)(lVar32 + 0x4a);
    if ((bVar28 != 0xff) && ((uVar42 >> (bVar28 & 0x1f) & 1) != 0)) {
      return (uint)bVar28;
    }
    uVar29 = extraout_EDX_00;
    if ((byte)pBVar48 < 4) {
      bVar28 = *(byte *)((long)(((RARegMask *)&pBVar53->_allocator)->_masks)._data +
                        ((ulong)pBVar48 & 0xff));
      if (bVar28 == 0) goto LAB_0012382f;
      uVar29 = *(uint *)((long)&(pBVar53->super_FuncPass).super_Pass._name + 4) >>
               ((byte)pBVar48 * '\b' & 0x1f) & 0xff;
      lVar57 = 0;
      goto LAB_00123806;
    }
  }
  pBStack_4d8 = (BaseRAPass *)0x123865;
  decideOnReassignment();
  pBStack_4f8 = pBVar40;
  pBStack_4f0 = pBVar52;
  pBStack_4e8 = pBVar61;
  pBStack_4e0 = pBVar63;
  pBStack_4d8 = pBVar41;
  if (uVar29 == 0) {
LAB_00123944:
    pBStack_500 = (BaseRAPass *)0x123949;
    decideOnSpillFor();
LAB_00123949:
    pBStack_500 = (BaseRAPass *)0x12394e;
    decideOnSpillFor();
  }
  else {
    if (3 < (byte)pBVar48) goto LAB_00123949;
    uVar42 = 0;
    if (uVar29 != 0) {
      for (; (uVar29 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
      }
    }
    uVar60 = (ulong)pBVar48 & 0xff;
    pBVar48 = (BaseRAPass *)(((RAAssignment *)&pBVar25->field_0x48)->_physToWorkIds)._data[uVar60];
    uVar35 = (((RARegMask *)&pBVar48->_allocator)->_masks)._data[(ulong)uVar42 - 6];
    pBVar37 = (BaseRAPass *)(ulong)uVar35;
    uVar29 = uVar29 - 1 & uVar29;
    if (uVar29 == 0) {
LAB_00123933:
      *(uint *)&(pBVar51->super_FuncPass).super_Pass._vptr_Pass = uVar35;
      return uVar42;
    }
    pBVar53 = (BaseRAPass *)(pBVar25->super_FuncPass).super_Pass._vptr_Pass;
    uVar30 = *(uint *)&pBVar53->field_0x148;
    if (uVar35 < uVar30) {
      lVar32 = *(long *)&pBVar53->_workRegs;
      uVar54 = (uint)(*(float *)(*(long *)(lVar32 + (long)pBVar37 * 8) + 100) * 1048576.0);
      uVar38 = (((RAAssignment *)&pBVar25->field_0x48)->_physToWorkMap->dirty)._masks._data[uVar60];
      pBVar25 = (BaseRAPass *)(ulong)uVar38;
      uVar35 = uVar54 + 0x40000;
      if ((uVar38 >> (uVar42 & 0x1f) & 1) == 0) {
        uVar35 = uVar54;
      }
      pBVar53 = (BaseRAPass *)(ulong)uVar35;
      while( true ) {
        uVar54 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
          }
        }
        pBVar40 = (BaseRAPass *)(ulong)uVar54;
        uVar35 = (((RARegMask *)&pBVar48->_allocator)->_masks)._data
                 [(long)(&pBVar40[-1].field_0x3b0 + 0xfa)];
        pBVar61 = (BaseRAPass *)(ulong)uVar35;
        if (uVar30 <= uVar35) break;
        uVar35 = (uint)(*(float *)(*(long *)(lVar32 + (long)pBVar61 * 8) + 100) * 1048576.0);
        pBVar63 = (BaseRAPass *)(ulong)uVar35;
        pBVar52 = (BaseRAPass *)(ulong)(uVar35 + 0x40000);
        if ((uVar38 >> (uVar54 & 0x1f) & 1) == 0) {
          pBVar52 = pBVar63;
        }
        bVar65 = (uint)pBVar52 < (uint)pBVar53;
        if (bVar65) {
          pBVar37 = pBVar61;
          pBVar53 = pBVar52;
        }
        uVar35 = (uint)pBVar37;
        if (bVar65) {
          uVar42 = uVar54;
        }
        uVar29 = uVar29 - 1 & uVar29;
        pBVar41 = (BaseRAPass *)(ulong)uVar29;
        if (uVar29 == 0) goto LAB_00123933;
      }
      pBStack_500 = (BaseRAPass *)0x123944;
      decideOnSpillFor();
      goto LAB_00123944;
    }
  }
  pBStack_500 = (BaseRAPass *)0x123953;
  decideOnSpillFor();
  lVar32 = *(long *)&pBVar48->field_0x20;
  pIVar44 = (InstNode *)(ulong)*(uint *)(lVar32 + 0x10);
  if (pIVar44 == (InstNode *)0x0) {
    return 0;
  }
  pBStack_540 = (BaseRAPass *)&pBVar25->field_0x48;
  lVar57 = lVar32 + 0x54;
  pIVar59 = (InstNode *)0x0;
  pBVar37 = pBVar25;
  pIStack_538 = pIVar44;
  pBStack_530 = pBVar48;
  pBStack_528 = pBVar40;
  pBStack_520 = pBVar52;
  pBStack_518 = pBVar58;
  pBStack_510 = pBVar61;
  pBStack_508 = pBVar63;
  pBStack_500 = pBVar41;
  do {
    if ((InstNode *)(ulong)*(uint *)(lVar32 + 0x10) <= pIVar59) {
      pBStack_558 = (BaseRAPass *)0x123a70;
      spillAfterAllocation();
LAB_00123a70:
      pBStack_558 = (BaseRAPass *)0x123a75;
      spillAfterAllocation();
LAB_00123a75:
      pBStack_558 = (BaseRAPass *)0x123a7a;
      spillAfterAllocation();
LAB_00123a7a:
      pBStack_558 = (BaseRAPass *)0x123a7f;
      spillAfterAllocation();
LAB_00123a7f:
      pBStack_558 = (BaseRAPass *)allocBranch;
      spillAfterAllocation();
      (((BaseCompiler *)(pBVar37->super_FuncPass).super_Pass._cb)->super_BaseBuilder)._cursor =
           *(BaseNode **)pIVar44;
      lStack_580 = lVar57;
      pBStack_578 = pBVar52;
      pIStack_570 = pIVar59;
      pBStack_568 = pBVar25;
      lStack_560 = lVar32;
      pBStack_558 = pBVar41;
      if ((*(PhysToWorkMap **)(block + 200) != (PhysToWorkMap *)0x0) &&
         (EVar15 = switchToAssignment((RALocalAllocator *)pBVar37,*(PhysToWorkMap **)(block + 200),
                                      (ZoneBitVector *)(block + 0x78),
                                      SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),true), EVar15 != 0)
         ) {
        return EVar15;
      }
      EVar15 = allocInst((RALocalAllocator *)pBVar37,pIVar44);
      if (EVar15 != 0) {
        return EVar15;
      }
      uVar29 = *(uint *)(block + 0xb8);
      if ((ulong)uVar29 == 0xffffffff) {
        pRVar26 = block + 0xbc;
LAB_00123b18:
        EVar15 = spillScratchGpRegsBeforeEntry((RALocalAllocator *)pBVar37,*(RegMask *)pRVar26);
        if (EVar15 != 0) {
          return EVar15;
        }
        pBVar41 = (BaseRAPass *)(pBVar37->super_FuncPass).super_Pass._vptr_Pass;
        if (*(long *)(block + 200) == 0) {
          EVar15 = BaseRAPass::setBlockEntryAssignment
                             (pBVar41,block,*(RABlock **)&pBVar37->field_0xd8,
                              (RAAssignment *)&pBVar37->field_0x48);
          if (EVar15 != 0) {
            return EVar15;
          }
        }
        else {
          pBVar10 = *(BaseNode **)pBVar41->_extraBlock;
          pBVar27 = BaseBuilder::setCursor
                              ((BaseBuilder *)(pBVar37->super_FuncPass).super_Pass._cb,pBVar10);
          pWVar21 = ((RAAssignment *)&pBVar37->field_0x48)->_workToPhysMap;
          memcpy(*(PhysToWorkMap **)&(pBVar37->_blocks).field_0x0,
                 ((RAAssignment *)&pBVar37->field_0x48)->_physToWorkMap,
                 (ulong)*(uint *)&pBVar37->_func * 4 + 0x20);
          memcpy(pBVar37->_extraBlock,pWVar21,(ulong)*(uint32_t *)((long)&pBVar37->_func + 4));
          EVar15 = switchToAssignment((RALocalAllocator *)pBVar37,*(PhysToWorkMap **)(block + 200),
                                      (ZoneBitVector *)(block + 0x78),
                                      SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),false);
          if (EVar15 != 0) {
            return EVar15;
          }
          pBVar49 = (BaseCompiler *)(pBVar37->super_FuncPass).super_Pass._cb;
          if ((pBVar49->super_BaseBuilder)._cursor != pBVar10) {
            if ((uint)(byte)pIVar44[0x13] <= (byte)pIVar44[0x12] - 1) goto LAB_00123cba;
            lVar32 = (ulong)((byte)pIVar44[0x12] - 1) * 0x10;
            if ((*(uint *)(pIVar44 + lVar32 + 0x40) & 7) != 5) goto LAB_00123cbf;
            (*(pBVar49->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&uStack_5a8);
            uStack_598 = *(undefined8 *)(pIVar44 + lVar32 + 0x40);
            uStack_590 = *(undefined8 *)(pIVar44 + lVar32 + 0x48);
            *(undefined4 *)(pIVar44 + lVar32 + 0x40) = uStack_5a8;
            *(undefined4 *)(pIVar44 + lVar32 + 0x44) = uStack_5a4;
            *(undefined4 *)(pIVar44 + lVar32 + 0x48) = uStack_5a0;
            *(undefined4 *)(pIVar44 + lVar32 + 0x4c) = uStack_59c;
            pIVar44[0x34] = (InstNode)((byte)pIVar44[0x34] & 0xef);
            iVar16 = (*(((BaseRAPass *)(pBVar37->super_FuncPass).super_Pass._vptr_Pass)->
                       super_FuncPass).super_Pass._vptr_Pass[0xd])();
            if (iVar16 != 0) {
              return iVar16;
            }
            pBVar49 = (BaseCompiler *)(pBVar37->super_FuncPass).super_Pass._cb;
            (pBVar49->super_BaseBuilder)._cursor = pBVar10;
            (*(pBVar49->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                      (pBVar49,&uStack_5a8);
            pBVar49 = (BaseCompiler *)(pBVar37->super_FuncPass).super_Pass._cb;
          }
          (pBVar49->super_BaseBuilder)._cursor = pBVar27;
          pBVar10 = (BaseNode *)((RAAssignment *)&pBVar37->field_0x48)->_workToPhysMap;
          pPVar20 = ((RAAssignment *)&pBVar37->field_0x48)->_physToWorkMap;
          pPVar22 = *(PhysToWorkMap **)&(pBVar37->_blocks).field_0x0;
          ((RAAssignment *)&pBVar37->field_0x48)->_workToPhysMap =
               (WorkToPhysMap *)pBVar37->_extraBlock;
          ((RAAssignment *)&pBVar37->field_0x48)->_physToWorkMap = pPVar22;
          pBVar37->_extraBlock = pBVar10;
          *(PhysToWorkMap **)&(pBVar37->_blocks).field_0x0 = pPVar20;
          lVar32 = 0;
          do {
            ppuVar1 = (((RAAssignment *)&pBVar37->field_0x48)->_physToWorkIds)._data + lVar32;
            puVar55 = *ppuVar1;
            puVar36 = ppuVar1[1];
            puVar11 = (uint *)((undefined8 *)((long)(&pBVar37->_formatOptions + 4) + lVar32 * 8))[1]
            ;
            ppuVar1 = (((RAAssignment *)&pBVar37->field_0x48)->_physToWorkIds)._data + lVar32;
            *ppuVar1 = *(uint **)((long)(&pBVar37->_formatOptions + 4) + lVar32 * 8);
            ppuVar1[1] = puVar11;
            *(undefined8 *)((long)(&pBVar37->_formatOptions + 4) + lVar32 * 8) = puVar55;
            ((undefined8 *)((long)(&pBVar37->_formatOptions + 4) + lVar32 * 8))[1] = puVar36;
            lVar32 = lVar32 + 2;
          } while (lVar32 != 4);
        }
        iVar16 = 0;
      }
      else {
        if (uVar29 < *(uint *)(*(long *)block + 0xf0)) {
          pRVar26 = (RABlock *)((ulong)uVar29 * 0x20 + *(long *)(*(long *)block + 0xe8));
          goto LAB_00123b18;
        }
        allocBranch();
LAB_00123cba:
        allocBranch();
LAB_00123cbf:
        iVar16 = 3;
      }
      return iVar16;
    }
    if ((*(byte *)(lVar57 + 2) & 2) != 0) {
      uVar29 = *(uint *)(lVar57 + -8);
      pBVar52 = (BaseRAPass *)(ulong)uVar29;
      pBVar51 = (BaseRAPass *)(pBVar25->super_FuncPass).super_Pass._vptr_Pass;
      if (*(uint *)&pBVar51->field_0x148 <= uVar29) goto LAB_00123a70;
      lVar9 = *(long *)(*(long *)&pBVar51->_workRegs + (long)pBVar52 * 8);
      if (*(char *)(lVar9 + 0x4a) != -1) goto LAB_00123a4a;
      if ((((RAAssignment *)&pBVar25->field_0x48)->_layout).workCount <= uVar29) goto LAB_00123a75;
      bVar28 = ((RAAssignment *)&pBVar25->field_0x48)->_workToPhysMap[(long)pBVar52].physIds[0];
      pBVar41 = (BaseRAPass *)(ulong)bVar28;
      if (bVar28 == 0xff) goto LAB_00123a4a;
      RVar14 = *(RegGroup *)(lVar9 + 0x21);
      (((BaseCompiler *)(pBVar25->super_FuncPass).super_Pass._cb)->super_BaseBuilder)._cursor =
           (BaseNode *)pBStack_530;
      if (0x1f < bVar28) goto LAB_00123a7a;
      RVar14 = RVar14 & kMaxValue;
      if (RVar14 < kPC) {
        if (((((RAAssignment *)&pBVar25->field_0x48)->_physToWorkMap->dirty)._masks._data[RVar14] >>
             (bVar28 & 0x1f) & 1) != 0) {
          pBStack_558 = (BaseRAPass *)0x123a2d;
          uStack_548 = (ulong)RVar14;
          EVar15 = onSaveReg((RALocalAllocator *)pBVar25,RVar14,uVar29,(uint)bVar28);
          RVar14 = (RegGroup)uStack_548;
          if (EVar15 != 0) {
            return EVar15;
          }
        }
        pBStack_558 = (BaseRAPass *)0x123a45;
        pBVar37 = pBStack_540;
        RAAssignment::unassign((RAAssignment *)pBStack_540,RVar14,uVar29,(uint)bVar28);
        pIVar44 = pIStack_538;
        goto LAB_00123a4a;
      }
      goto LAB_00123a7f;
    }
LAB_00123a4a:
    pIVar59 = pIVar59 + 1;
    lVar57 = lVar57 + 0x20;
    if (pIVar44 == pIVar59) {
      return 0;
    }
  } while( true );
LAB_001230c8:
  pBVar64 = pBVar63;
  pBVar52 = (BaseRAPass *)((long)&(pBVar52->super_FuncPass).super_Pass._vptr_Pass + 1);
  pBVar53 = pBVar25;
  pBVar58 = pBVar33;
  pBVar63 = pBVar64;
  if (pBVar52 == pBStack_470) goto LAB_001230d9;
  goto LAB_00122df5;
  while (lVar57 = lVar57 + 0x20, (ulong)bVar28 * 0x20 != lVar57) {
LAB_00123806:
    if (*(uint *)((long)(((RAAssignment *)&pBVar53->field_0x48)->_physToWorkIds)._data +
                 lVar57 + (ulong)(uVar29 << 5) + -0x24) == extraout_EDX_00) {
      if ((*(uint *)((long)(((RAAssignment *)&pBVar53->field_0x48)->_physToWorkIds)._data +
                    lVar57 + (ulong)(uVar29 << 5) + -0x1c) & 0x40008) != 0) {
        iVar16 = 0;
        if (uVar42 != 0) {
          for (; (uVar42 >> iVar16 & 1) == 0; iVar16 = iVar16 + 1) {
          }
          return iVar16;
        }
        return 0;
      }
      break;
    }
  }
LAB_0012382f:
  if ((*(byte *)(lVar32 + 0x24) & 4) != 0) {
    return 0xff;
  }
  uVar42 = ~*(uint *)(lVar32 + 0x38) & uVar42;
  if (uVar42 != 0) {
    uVar29 = ~(((RARegMask *)&pBVar25->field_0x38)->_masks)._data[(ulong)pBVar48 & 0xff] & uVar42;
    if (uVar29 == 0) {
      uVar29 = uVar42;
    }
    iVar16 = 0;
    if (uVar29 != 0) {
      for (; (uVar29 >> iVar16 & 1) == 0; iVar16 = iVar16 + 1) {
      }
      return iVar16;
    }
    return 0;
  }
  return 0xff;
}

Assistant:

Error RALocalAllocator::init() noexcept {
  PhysToWorkMap* physToWorkMap;
  WorkToPhysMap* workToPhysMap;

  physToWorkMap = _pass->newPhysToWorkMap();
  workToPhysMap = _pass->newWorkToPhysMap();
  if (!physToWorkMap || !workToPhysMap)
    return DebugUtils::errored(kErrorOutOfMemory);

  _curAssignment.initLayout(_pass->_physRegCount, _pass->workRegs());
  _curAssignment.initMaps(physToWorkMap, workToPhysMap);

  physToWorkMap = _pass->newPhysToWorkMap();
  workToPhysMap = _pass->newWorkToPhysMap();
  _tmpWorkToPhysMap = _pass->newWorkToPhysMap();

  if (!physToWorkMap || !workToPhysMap || !_tmpWorkToPhysMap)
    return DebugUtils::errored(kErrorOutOfMemory);

  _tmpAssignment.initLayout(_pass->_physRegCount, _pass->workRegs());
  _tmpAssignment.initMaps(physToWorkMap, workToPhysMap);

  return kErrorOk;
}